

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O3

void verify_high_num_keeping_headers_param_test(void)

{
  undefined1 auVar1 [16];
  fdb_status s;
  fdb_status fVar2;
  fdb_status extraout_EAX;
  sb_decision_t sVar3;
  int iVar4;
  fdb_status extraout_EAX_00;
  fdb_status extraout_EAX_01;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  fdb_kvs_handle *pfVar8;
  fdb_kvs_handle *pfVar9;
  fdb_kvs_handle *pfVar10;
  char cVar11;
  char *pcVar12;
  char *pcVar13;
  fdb_config *pfVar14;
  char *pcVar15;
  fdb_doc **doc;
  uint uVar16;
  uint uVar17;
  size_t unaff_RBP;
  ulong uVar18;
  size_t sVar19;
  fdb_kvs_handle *pfVar20;
  fdb_kvs_handle **ptr_handle;
  fdb_kvs_handle *unaff_R12;
  uint uVar21;
  ulong unaff_R13;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 handle;
  char *unaff_R14;
  fdb_config *pfVar22;
  char *pcVar23;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar24;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar25;
  char *unaff_R15;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *snap_db;
  void *rvalue;
  char keybuf [16];
  size_t rvalue_len;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_config fconfig;
  fdb_kvs_handle *pfStackY_2980;
  fdb_file_handle *pfStackY_2978;
  fdb_kvs_config fStackY_2970;
  char acStackY_2958 [264];
  fdb_config fStackY_2850;
  char acStackY_2758 [520];
  fdb_doc **ppfStackY_2550;
  size_t sStackY_2540;
  char *pcStackY_2538;
  char *pcStackY_2530;
  code *pcStackY_2528;
  fdb_kvs_handle *pfStack_2518;
  fdb_file_handle *pfStack_2510;
  fdb_iterator *pfStack_2508;
  fdb_doc *pfStack_2500;
  fdb_kvs_handle *pfStack_24f8;
  timeval tStack_24f0;
  char acStack_24e0 [512];
  fdb_kvs_config fStack_22e0;
  fdb_file_info fStack_22c8;
  char acStack_2280 [256];
  fdb_config fStack_2180;
  char *pcStack_2088;
  fdb_kvs_handle *pfStack_2080;
  fdb_kvs_handle *pfStack_2078;
  fdb_kvs_handle *pfStack_2070;
  fdb_kvs_handle *pfStack_2068;
  fdb_kvs_handle *pfStack_2060;
  fdb_kvs_handle *pfStack_2050;
  fdb_file_handle *pfStack_2048;
  uint uStack_203c;
  fdb_kvs_info fStack_2038;
  timeval tStack_2008;
  fdb_kvs_config fStack_1ff8;
  undefined1 auStack_1fe0 [80];
  docio_handle *pdStack_1f90;
  btreeblk_handle *pbStack_1f88;
  btree_blk_ops *pbStack_1f80;
  filemgr_ops *pfStack_1f78;
  fdb_config fStack_1f70;
  undefined1 uStack_1d99;
  fdb_kvs_handle fStack_1d98;
  fdb_kvs_handle *pfStack_1b90;
  char *pcStack_1b88;
  char *pcStack_1b80;
  fdb_kvs_handle *pfStack_1b78;
  fdb_kvs_handle *pfStack_1b70;
  fdb_file_handle *pfStack_1b68;
  timeval tStack_1b60;
  undefined1 auStack_1b50 [536];
  undefined1 auStack_1938 [375];
  undefined1 uStack_17c1;
  fdb_kvs_handle *pfStack_1738;
  undefined8 uStack_1720;
  fdb_kvs_handle *pfStack_16f8;
  fdb_kvs_handle *pfStack_16f0;
  fdb_kvs_handle *pfStack_16e8;
  fdb_kvs_handle *pfStack_16e0;
  fdb_kvs_handle *pfStack_16d8;
  code *pcStack_16d0;
  fdb_kvs_handle *pfStack_16c8;
  fdb_file_handle *pfStack_16c0;
  fdb_kvs_handle *pfStack_16b8;
  fdb_kvs_handle *pfStack_16b0;
  fdb_kvs_config fStack_16a8;
  timeval tStack_1690;
  fdb_file_info fStack_1680;
  fdb_kvs_info fStack_1638;
  undefined1 auStack_1608 [512];
  fdb_kvs_handle fStack_1408;
  size_t sStack_1200;
  char *pcStack_11f8;
  char *pcStack_11f0;
  code *pcStack_11e8;
  fdb_kvs_handle *pfStack_11e0;
  fdb_file_handle *pfStack_11d8;
  fdb_kvs_info fStack_11d0;
  timeval tStack_11a0;
  fdb_kvs_config fStack_1190;
  fdb_file_info fStack_1178;
  char acStack_1130 [256];
  char acStack_1030 [511];
  undefined1 uStack_e31;
  fdb_config fStack_c30;
  char *pcStack_b38;
  fdb_config *pfStack_b30;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_b28;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_b20;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_b18;
  code *pcStack_b10;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_b08;
  fdb_file_handle *pfStack_b00;
  size_t sStack_af8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_af0;
  kvs_info *pkStack_ae8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_ae0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_ad8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_ad0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_ac8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_ac0;
  timeval tStack_ab8;
  undefined1 auStack_aa8 [24];
  fdb_file_info fStack_a90;
  fdb_config fStack_a48;
  fdb_config fStack_948;
  fdb_config *pfStack_850;
  fdb_kvs_handle *pfStack_848;
  ulong uStack_840;
  fdb_config *pfStack_838;
  fdb_file_info *pfStack_830;
  code *pcStack_828;
  fdb_kvs_handle *pfStack_820;
  fdb_file_handle *pfStack_818;
  fdb_kvs_handle *pfStack_810;
  fdb_config *pfStack_808;
  size_t sStack_800;
  fdb_kvs_config fStack_7f8;
  timeval tStack_7e0;
  fdb_file_info fStack_7d0;
  fdb_config fStack_788;
  fdb_config *pfStack_690;
  fdb_kvs_handle *pfStack_688;
  fdb_config *pfStack_680;
  fdb_file_info *pfStack_678;
  code *pcStack_670;
  fdb_kvs_handle *pfStack_668;
  fdb_file_handle *pfStack_660;
  fdb_kvs_handle *pfStack_658;
  fdb_kvs_config fStack_650;
  undefined1 auStack_638 [40];
  fdb_file_info fStack_610;
  fdb_config fStack_5c8;
  ulong uStack_4d0;
  fdb_kvs_handle *pfStack_4c8;
  ulong uStack_4c0;
  fdb_config *pfStack_4b8;
  fdb_file_info *pfStack_4b0;
  code *pcStack_4a8;
  fdb_kvs_handle *pfStack_4a0;
  fdb_file_handle *pfStack_498;
  fdb_kvs_handle *pfStack_490;
  fdb_config *pfStack_488;
  size_t sStack_480;
  fdb_kvs_config fStack_478;
  timeval tStack_460;
  undefined1 auStack_450 [280];
  uint8_t auStack_338 [40];
  char acStack_310 [264];
  fdb_kvs_handle *pfStack_208;
  ulong uStack_1f8;
  char *pcStack_1f0;
  fdb_file_info *pfStack_1e8;
  code *pcStack_1e0;
  fdb_kvs_handle *local_1d8;
  fdb_file_handle *local_1d0;
  fdb_kvs_handle *local_1c8;
  void *local_1c0;
  char local_1b8 [24];
  size_t local_1a0;
  fdb_kvs_config local_198;
  timeval local_180;
  fdb_file_info local_170;
  undefined1 local_f9;
  uint32_t local_58;
  undefined4 uStack_54;
  
  pcStack_1e0 = (code *)0x10bd21;
  memleak_start();
  pcStack_1e0 = (code *)0x10bd2d;
  gettimeofday(&local_180,(__timezone_ptr_t)0x0);
  pcVar12 = &stack0xfffffffffffffed8;
  pcStack_1e0 = (code *)0x10bd3d;
  fdb_get_default_config();
  pcStack_1e0 = (code *)0x10bd47;
  fdb_get_default_kvs_config();
  pcStack_1e0 = (code *)0x10bd53;
  system("rm -rf  staleblktest* > errorlog.txt");
  local_f9 = 0;
  local_58 = 100;
  uStack_54 = 0;
  pcStack_1e0 = (code *)0x10bd76;
  fVar2 = fdb_open(&local_1d0,"./staleblktest1",(fdb_config *)pcVar12);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bfe5;
  pcStack_1e0 = (code *)0x10bd97;
  fVar2 = fdb_kvs_open(local_1d0,&local_1d8,"num_keep",&local_198);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bfec;
  unaff_R13 = 0;
  pcVar12 = "key";
  unaff_R14 = "val";
  unaff_R15 = (char *)&local_170;
  do {
    pcStack_1e0 = (code *)0x10bdcf;
    fVar2 = fdb_set_kv(local_1d8,"key",4,"val",4);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010bfd0:
      pcStack_1e0 = (code *)0x10bfd7;
      verify_high_num_keeping_headers_param_test();
      goto LAB_0010bfd7;
    }
    pcStack_1e0 = (code *)0x10bde4;
    fVar2 = fdb_get_file_info(local_1d0,(fdb_file_info *)unaff_R15);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_1e0 = (code *)0x10bfd0;
      verify_high_num_keeping_headers_param_test();
      goto LAB_0010bfd0;
    }
    unaff_R13 = unaff_R13 - 1;
  } while (local_170.file_size < 0x1000001);
  pcStack_1e0 = (code *)0x10be0c;
  fVar2 = fdb_commit(local_1d0,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bff3;
  pcVar12 = "key%d";
  unaff_R14 = local_1b8;
  unaff_R15 = "reu";
  unaff_RBP = 0;
  do {
    pcStack_1e0 = (code *)0x10be38;
    sprintf(unaff_R14,"key%d",unaff_RBP);
    unaff_R12 = local_1d8;
    pcStack_1e0 = (code *)0x10be44;
    sVar5 = strlen(unaff_R14);
    pcStack_1e0 = (code *)0x10be5b;
    fVar2 = fdb_set_kv(unaff_R12,unaff_R14,sVar5,"reu",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bfde;
    pcStack_1e0 = (code *)0x10be72;
    fVar2 = fdb_commit(local_1d0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bfd7;
    uVar16 = (int)unaff_RBP + 1;
    unaff_RBP = (size_t)uVar16;
  } while (uVar16 != 100);
  pcVar12 = "key";
  unaff_R14 = "val";
  unaff_RBP = unaff_R13 & 0xffffffff;
  do {
    uVar16 = (int)unaff_RBP + 1;
    unaff_RBP = (size_t)uVar16;
    if (uVar16 == 0) goto LAB_0010bebb;
    pcStack_1e0 = (code *)0x10beb0;
    fVar2 = fdb_set_kv(local_1d8,"key",4,"val",4);
  } while (fVar2 == FDB_RESULT_SUCCESS);
  pcStack_1e0 = (code *)0x10bebb;
  verify_high_num_keeping_headers_param_test();
LAB_0010bebb:
  pcStack_1e0 = (code *)0x10beca;
  fVar2 = fdb_commit(local_1d0,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010bffa;
  pcStack_1e0 = (code *)0x10bee6;
  fVar2 = fdb_snapshot_open(local_1d8,&local_1c8,-unaff_R13);
  if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010c001;
  pcStack_1e0 = (code *)0x10bf05;
  fVar2 = fdb_snapshot_open(local_1d8,&local_1c8,1 - unaff_R13);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c006;
  unaff_R14 = local_1b8;
  pcStack_1e0 = (code *)0x10bf1e;
  sVar5 = strlen(unaff_R14);
  pcStack_1e0 = (code *)0x10bf36;
  fVar2 = fdb_get_kv(local_1d8,unaff_R14,sVar5,&local_1c0,&local_1a0);
  pcVar12 = (char *)local_1d8;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c00d;
  pcStack_1e0 = (code *)0x10bf48;
  fVar2 = fdb_free_block(local_1c0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c014;
  pcStack_1e0 = (code *)0x10bf5a;
  fVar2 = fdb_kvs_close(local_1c8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c01b;
  pcStack_1e0 = (code *)0x10bf6c;
  fVar2 = fdb_close(local_1d0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c022;
  pcStack_1e0 = (code *)0x10bf79;
  fVar2 = fdb_shutdown();
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_1e0 = (code *)0x10bf86;
    memleak_end();
    pcVar12 = "%s PASSED\n";
    if (verify_high_num_keeping_headers_param_test()::__test_pass != '\0') {
      pcVar12 = "%s FAILED\n";
    }
    pcStack_1e0 = (code *)0x10bfb7;
    fprintf(_stderr,pcVar12,"verify high num keeping headers param test");
    return;
  }
  goto LAB_0010c029;
LAB_0010bfd7:
  pcStack_1e0 = (code *)0x10bfde;
  verify_high_num_keeping_headers_param_test();
LAB_0010bfde:
  pcStack_1e0 = (code *)0x10bfe5;
  verify_high_num_keeping_headers_param_test();
LAB_0010bfe5:
  pcStack_1e0 = (code *)0x10bfec;
  verify_high_num_keeping_headers_param_test();
LAB_0010bfec:
  pcStack_1e0 = (code *)0x10bff3;
  verify_high_num_keeping_headers_param_test();
LAB_0010bff3:
  pcStack_1e0 = (code *)0x10bffa;
  verify_high_num_keeping_headers_param_test();
LAB_0010bffa:
  pcStack_1e0 = (code *)0x10c001;
  verify_high_num_keeping_headers_param_test();
LAB_0010c001:
  pcStack_1e0 = (code *)0x10c006;
  verify_high_num_keeping_headers_param_test();
LAB_0010c006:
  pcStack_1e0 = (code *)0x10c00d;
  verify_high_num_keeping_headers_param_test();
LAB_0010c00d:
  pcStack_1e0 = (code *)0x10c014;
  verify_high_num_keeping_headers_param_test();
LAB_0010c014:
  pcStack_1e0 = (code *)0x10c01b;
  verify_high_num_keeping_headers_param_test();
LAB_0010c01b:
  pcStack_1e0 = (code *)0x10c022;
  verify_high_num_keeping_headers_param_test();
LAB_0010c022:
  pcStack_1e0 = (code *)0x10c029;
  verify_high_num_keeping_headers_param_test();
  fVar2 = extraout_EAX;
LAB_0010c029:
  uVar18 = (ulong)(uint)fVar2;
  pcStack_1e0 = snapshot_before_block_reuse_test;
  verify_high_num_keeping_headers_param_test();
  pcStack_4a8 = (code *)0x10c048;
  pfStack_208 = (fdb_kvs_handle *)pcVar12;
  uStack_1f8 = unaff_R13;
  pcStack_1f0 = unaff_R14;
  pfStack_1e8 = (fdb_file_info *)unaff_R15;
  pcStack_1e0 = (code *)unaff_RBP;
  memleak_start();
  pcStack_4a8 = (code *)0x10c054;
  gettimeofday(&tStack_460,(__timezone_ptr_t)0x0);
  pcVar12 = auStack_450 + 0x48;
  pcStack_4a8 = (code *)0x10c064;
  fdb_get_default_config();
  pcStack_4a8 = (code *)0x10c06e;
  fdb_get_default_kvs_config();
  pcStack_4a8 = (code *)0x10c07a;
  system("rm -rf  staleblktest* > errorlog.txt");
  auStack_338[0] = '\x01';
  auStack_338[1] = '\0';
  auStack_338[2] = '\0';
  auStack_338[3] = '\0';
  auStack_338[4] = '\0';
  auStack_338[5] = '\0';
  auStack_338[6] = '\0';
  auStack_338[7] = '\0';
  pcStack_4a8 = (code *)0x10c099;
  fVar2 = fdb_open(&pfStack_498,"./staleblktest1",(fdb_config *)pcVar12);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_4a8 = (code *)0x10c0b3;
    fVar2 = fdb_kvs_open_default(pfStack_498,&pfStack_4a0,&fStack_478);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3a6;
    pcStack_4a8 = (code *)0x10c0dd;
    fVar2 = fdb_set_kv(pfStack_4a0,"key",4,"snp",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3ad;
    pcStack_4a8 = (code *)0x10c0f4;
    fVar2 = fdb_commit(pfStack_498,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3b4;
    ptr_handle = &pfStack_490;
    cVar11 = (char)(uVar18 & 0xffffffff);
    pfVar20 = pfStack_4a0;
    if (cVar11 == '\0') {
LAB_0010c120:
      pcStack_4a8 = (code *)0x10c12a;
      fVar2 = fdb_snapshot_open(pfVar20,ptr_handle,1);
      if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0010c132;
      goto LAB_0010c3f2;
    }
    pcStack_4a8 = (code *)0x10c115;
    fVar2 = fdb_snapshot_open(pfStack_4a0,ptr_handle,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfVar20 = (fdb_kvs_handle *)(ulong)(uint)fVar2;
      pcStack_4a8 = (code *)0x10c120;
      snapshot_before_block_reuse_test();
      goto LAB_0010c120;
    }
LAB_0010c132:
    unaff_RBP = 0;
    unaff_R12 = (fdb_kvs_handle *)auStack_450;
    do {
      pcStack_4a8 = (code *)0x10c161;
      fVar2 = fdb_set_kv(pfStack_4a0,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c373;
      pcStack_4a8 = (code *)0x10c176;
      fVar2 = fdb_get_file_info(pfStack_498,(fdb_file_info *)unaff_R12);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c36c;
      uVar16 = (int)unaff_RBP + 1;
      unaff_RBP = (size_t)uVar16;
    } while ((ulong)auStack_450._40_8_ < (fdb_file_handle *)0x1000001);
    unaff_R12 = (fdb_kvs_handle *)0x0;
    pcVar12 = "key";
    unaff_R15 = "val";
    do {
      unaff_R13 = (ulong)uVar16;
      do {
        pcStack_4a8 = (code *)0x10c1b9;
        fVar2 = fdb_set_kv(pfStack_4a0,"key",4,"val",4);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pcStack_4a8 = (code *)0x10c36c;
          snapshot_before_block_reuse_test();
          goto LAB_0010c36c;
        }
        uVar21 = (int)unaff_R13 - 1;
        unaff_R13 = (ulong)uVar21;
      } while (uVar21 != 0);
      pcStack_4a8 = (code *)0x10c1d5;
      fVar2 = fdb_commit(pfStack_498,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c37a;
      uVar21 = (int)unaff_R12 + 1;
      unaff_R12 = (fdb_kvs_handle *)(ulong)uVar21;
    } while (uVar21 != 5);
    pcStack_4a8 = (code *)0x10c1ef;
    sVar3 = sb_check_block_reusing(pfStack_4a0);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010c3bb;
    pcStack_4a8 = (code *)0x10c218;
    fVar2 = fdb_get_kv(pfStack_490,"key",4,&pfStack_488,&sStack_480);
    pfVar22 = pfStack_488;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3c0;
    pcStack_4a8 = (code *)0x10c239;
    iVar4 = bcmp(pfStack_488,"snp",sStack_480);
    if (iVar4 != 0) goto LAB_0010c3c7;
    pcStack_4a8 = (code *)0x10c24b;
    fVar2 = fdb_kvs_close(pfStack_490);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3cf;
    pfVar22 = (fdb_config *)0x147599;
    unaff_R15 = "val";
    do {
      pcStack_4a8 = (code *)0x10c27b;
      fVar2 = fdb_set_kv(pfStack_4a0,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c381;
      uVar16 = (int)unaff_RBP - 1;
      unaff_RBP = (size_t)uVar16;
    } while (uVar16 != 0);
    pcStack_4a8 = (code *)0x10c296;
    fVar2 = fdb_commit(pfStack_498,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3d6;
    pcStack_4a8 = (code *)0x10c2b1;
    fVar2 = fdb_snapshot_open(pfStack_4a0,&pfStack_490,1);
    if (fVar2 == FDB_RESULT_NO_DB_INSTANCE) {
      pcStack_4a8 = (code *)0x10c2c4;
      fVar2 = fdb_free_block(pfStack_488);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3dd;
      pcStack_4a8 = (code *)0x10c2d5;
      fVar2 = fdb_kvs_close(pfStack_4a0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3e4;
      pcStack_4a8 = (code *)0x10c2e7;
      fVar2 = fdb_close(pfStack_498);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStack_4a8 = (code *)0x10c2f4;
        fdb_shutdown();
        pcStack_4a8 = (code *)0x10c2f9;
        memleak_end();
        pcVar12 = "disk snapshot";
        if (cVar11 != '\0') {
          pcVar12 = "in-mem snapshot";
        }
        pcStack_4a8 = (code *)0x10c326;
        sprintf(acStack_310,"snapshot before block reuse test %s",pcVar12);
        pcVar12 = "%s PASSED\n";
        if (snapshot_before_block_reuse_test(bool)::__test_pass != '\0') {
          pcVar12 = "%s FAILED\n";
        }
        pcStack_4a8 = (code *)0x10c353;
        fprintf(_stderr,pcVar12,acStack_310);
        return;
      }
      goto LAB_0010c3eb;
    }
LAB_0010c388:
    unaff_R15 = "val";
    pcVar12 = "key";
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010c39a:
      pcStack_4a8 = (code *)0x10c39f;
      snapshot_before_block_reuse_test();
      goto LAB_0010c39f;
    }
    pcStack_4a8 = (code *)0x10c396;
    fVar2 = fdb_kvs_close(pfStack_490);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0010c39a;
  }
  else {
LAB_0010c39f:
    pcStack_4a8 = (code *)0x10c3a6;
    snapshot_before_block_reuse_test();
LAB_0010c3a6:
    pcStack_4a8 = (code *)0x10c3ad;
    snapshot_before_block_reuse_test();
LAB_0010c3ad:
    pcStack_4a8 = (code *)0x10c3b4;
    snapshot_before_block_reuse_test();
LAB_0010c3b4:
    pcStack_4a8 = (code *)0x10c3bb;
    snapshot_before_block_reuse_test();
LAB_0010c3bb:
    pcStack_4a8 = (code *)0x10c3c0;
    snapshot_before_block_reuse_test();
LAB_0010c3c0:
    pfVar22 = (fdb_config *)pcVar12;
    pcStack_4a8 = (code *)0x10c3c7;
    snapshot_before_block_reuse_test();
LAB_0010c3c7:
    pcStack_4a8 = (code *)0x10c3cf;
    snapshot_before_block_reuse_test();
LAB_0010c3cf:
    pcStack_4a8 = (code *)0x10c3d6;
    snapshot_before_block_reuse_test();
LAB_0010c3d6:
    pcStack_4a8 = (code *)0x10c3dd;
    snapshot_before_block_reuse_test();
LAB_0010c3dd:
    pcStack_4a8 = (code *)0x10c3e4;
    snapshot_before_block_reuse_test();
LAB_0010c3e4:
    pcStack_4a8 = (code *)0x10c3eb;
    snapshot_before_block_reuse_test();
LAB_0010c3eb:
    pcStack_4a8 = (code *)0x10c3f2;
    snapshot_before_block_reuse_test();
    pcVar12 = (char *)pfVar22;
LAB_0010c3f2:
    pcStack_4a8 = (code *)0x10c3f9;
    snapshot_before_block_reuse_test();
  }
  pcStack_4a8 = snapshot_after_block_reuse_test;
  snapshot_before_block_reuse_test();
  pcStack_670 = (code *)0x10c416;
  uStack_4d0 = uVar18 & 0xffffffff;
  pfStack_4c8 = unaff_R12;
  uStack_4c0 = unaff_R13;
  pfStack_4b8 = (fdb_config *)pcVar12;
  pfStack_4b0 = (fdb_file_info *)unaff_R15;
  pcStack_4a8 = (code *)unaff_RBP;
  memleak_start();
  pcStack_670 = (code *)0x10c422;
  gettimeofday((timeval *)(auStack_638 + 0x18),(__timezone_ptr_t)0x0);
  pcVar13 = (char *)&fStack_5c8;
  pcStack_670 = (code *)0x10c432;
  fdb_get_default_config();
  pcStack_670 = (code *)0x10c43c;
  fdb_get_default_kvs_config();
  pcStack_670 = (code *)0x10c448;
  system("rm -rf  staleblktest* > errorlog.txt");
  fStack_5c8.compaction_threshold = '\0';
  fStack_5c8.num_keeping_headers = 5;
  pcStack_670 = (code *)0x10c46b;
  fVar2 = fdb_open(&pfStack_660,"./staleblktest1",(fdb_config *)pcVar13);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_670 = (code *)0x10c48c;
    fVar2 = fdb_kvs_open(pfStack_660,&pfStack_668,"num_keep",&fStack_650);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6a9;
    unaff_R13 = 0;
    pcVar13 = "key";
    pcVar12 = "val";
    unaff_R15 = (char *)&fStack_610;
    do {
      pcStack_670 = (code *)0x10c4c4;
      fVar2 = fdb_set_kv(pfStack_668,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010c68d:
        pcStack_670 = (code *)0x10c694;
        snapshot_after_block_reuse_test();
        goto LAB_0010c694;
      }
      pcStack_670 = (code *)0x10c4d9;
      fVar2 = fdb_get_file_info(pfStack_660,(fdb_file_info *)unaff_R15);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_670 = (code *)0x10c68d;
        snapshot_after_block_reuse_test();
        goto LAB_0010c68d;
      }
      unaff_R13 = unaff_R13 - 1;
    } while (fStack_610.file_size < 0x1000001);
    pcStack_670 = (code *)0x10c501;
    fVar2 = fdb_commit(pfStack_660,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6b0;
    pcVar13 = "key%d";
    pcVar12 = auStack_638;
    unaff_R15 = "reu";
    unaff_RBP = 0;
    do {
      pcStack_670 = (code *)0x10c52d;
      sprintf(pcVar12,"key%d",unaff_RBP);
      unaff_R12 = pfStack_668;
      pcStack_670 = (code *)0x10c539;
      sVar5 = strlen(pcVar12);
      pcStack_670 = (code *)0x10c550;
      fVar2 = fdb_set_kv(unaff_R12,pcVar12,sVar5,"reu",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c69b;
      pcStack_670 = (code *)0x10c567;
      fVar2 = fdb_commit(pfStack_660,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c694;
      uVar16 = (int)unaff_RBP + 1;
      unaff_RBP = (size_t)uVar16;
    } while (uVar16 != 10);
    pcVar13 = "key";
    pcVar12 = "val";
    unaff_RBP = unaff_R13 & 0xffffffff;
    do {
      uVar16 = (int)unaff_RBP + 1;
      unaff_RBP = (size_t)uVar16;
      if (uVar16 == 0) goto LAB_0010c5b0;
      pcStack_670 = (code *)0x10c5a5;
      fVar2 = fdb_set_kv(pfStack_668,"key",4,"val",4);
    } while (fVar2 == FDB_RESULT_SUCCESS);
    pcStack_670 = (code *)0x10c5b0;
    snapshot_after_block_reuse_test();
LAB_0010c5b0:
    pcStack_670 = (code *)0x10c5bf;
    fVar2 = fdb_commit(pfStack_660,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6b7;
    pcStack_670 = (code *)0x10c5dd;
    fVar2 = fdb_snapshot_open(pfStack_668,&pfStack_658,6 - unaff_R13);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6be;
    pcStack_670 = (code *)0x10c5ef;
    fVar2 = fdb_kvs_close(pfStack_658);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6c5;
    pcStack_670 = (code *)0x10c60d;
    fVar2 = fdb_snapshot_open(pfStack_668,&pfStack_658,5 - unaff_R13);
    if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010c6cc;
    pcStack_670 = (code *)0x10c61f;
    fVar2 = fdb_kvs_close(pfStack_668);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6d1;
    pcStack_670 = (code *)0x10c631;
    fVar2 = fdb_close(pfStack_660);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_670 = (code *)0x10c63e;
      fdb_shutdown();
      pcStack_670 = (code *)0x10c643;
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (snapshot_after_block_reuse_test()::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pcStack_670 = (code *)0x10c674;
      fprintf(_stderr,pcVar12,"snapshot after block reuse test");
      return;
    }
  }
  else {
LAB_0010c6a2:
    pcStack_670 = (code *)0x10c6a9;
    snapshot_after_block_reuse_test();
LAB_0010c6a9:
    pcStack_670 = (code *)0x10c6b0;
    snapshot_after_block_reuse_test();
LAB_0010c6b0:
    pcStack_670 = (code *)0x10c6b7;
    snapshot_after_block_reuse_test();
LAB_0010c6b7:
    pcStack_670 = (code *)0x10c6be;
    snapshot_after_block_reuse_test();
LAB_0010c6be:
    pcStack_670 = (code *)0x10c6c5;
    snapshot_after_block_reuse_test();
LAB_0010c6c5:
    pcStack_670 = (code *)0x10c6cc;
    snapshot_after_block_reuse_test();
LAB_0010c6cc:
    pcStack_670 = (code *)0x10c6d1;
    snapshot_after_block_reuse_test();
LAB_0010c6d1:
    pcStack_670 = (code *)0x10c6d8;
    snapshot_after_block_reuse_test();
  }
  pcStack_670 = snapshot_inmem_before_block_reuse_test;
  snapshot_after_block_reuse_test();
  pcStack_828 = (code *)0x10c6f3;
  pfStack_690 = (fdb_config *)pcVar13;
  pfStack_688 = unaff_R12;
  pfStack_680 = (fdb_config *)pcVar12;
  pfStack_678 = (fdb_file_info *)unaff_R15;
  pcStack_670 = (code *)unaff_RBP;
  memleak_start();
  pcStack_828 = (code *)0x10c6ff;
  gettimeofday(&tStack_7e0,(__timezone_ptr_t)0x0);
  pfVar22 = &fStack_788;
  pcStack_828 = (code *)0x10c70f;
  fdb_get_default_config();
  pcStack_828 = (code *)0x10c719;
  fdb_get_default_kvs_config();
  pcStack_828 = (code *)0x10c725;
  system("rm -rf  staleblktest* > errorlog.txt");
  fStack_788.num_keeping_headers = 1;
  pcStack_828 = (code *)0x10c744;
  fVar2 = fdb_open(&pfStack_818,"./staleblktest1",pfVar22);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_828 = (code *)0x10c75e;
    fVar2 = fdb_kvs_open_default(pfStack_818,&pfStack_820,&fStack_7f8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca0d;
    pcStack_828 = (code *)0x10c788;
    fVar2 = fdb_set_kv(pfStack_820,"key",4,"snp",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca14;
    pcStack_828 = (code *)0x10c79f;
    fVar2 = fdb_commit(pfStack_818,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca1b;
    pcStack_828 = (code *)0x10c7bc;
    fVar2 = fdb_snapshot_open(pfStack_820,&pfStack_810,0xffffffffffffffff);
    pfVar14 = pfVar22;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca22;
    unaff_RBP = 0;
    unaff_R15 = (char *)&fStack_7d0;
    do {
      pcStack_828 = (code *)0x10c7f3;
      fVar2 = fdb_set_kv(pfStack_820,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c9da;
      pcStack_828 = (code *)0x10c808;
      fVar2 = fdb_get_file_info(pfStack_818,(fdb_file_info *)unaff_R15);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c9d3;
      uVar16 = (int)unaff_RBP + 1;
      unaff_RBP = (size_t)uVar16;
    } while (fStack_7d0.file_size < 0x1000001);
    unaff_R15 = (char *)0x0;
    pfVar14 = (fdb_config *)0x147599;
    pcVar12 = "val";
    do {
      unaff_R12 = (fdb_kvs_handle *)(ulong)uVar16;
      do {
        pcStack_828 = (code *)0x10c84b;
        fVar2 = fdb_set_kv(pfStack_820,"key",4,"val",4);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pcStack_828 = (code *)0x10c9d3;
          snapshot_inmem_before_block_reuse_test();
          goto LAB_0010c9d3;
        }
        uVar21 = (int)unaff_R12 - 1;
        unaff_R12 = (fdb_kvs_handle *)(ulong)uVar21;
      } while (uVar21 != 0);
      pcStack_828 = (code *)0x10c867;
      fVar2 = fdb_commit(pfStack_818,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c9e1;
      uVar21 = (int)unaff_R15 + 1;
      unaff_R15 = (char *)(ulong)uVar21;
    } while (uVar21 != 5);
    pcStack_828 = (code *)0x10c881;
    sVar3 = sb_check_block_reusing(pfStack_820);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010ca29;
    pcStack_828 = (code *)0x10c8aa;
    fVar2 = fdb_get_kv(pfStack_810,"key",4,&pfStack_808,&sStack_800);
    pfVar22 = pfStack_808;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca2e;
    pcStack_828 = (code *)0x10c8cb;
    iVar4 = bcmp(pfStack_808,"snp",sStack_800);
    if (iVar4 != 0) goto LAB_0010ca35;
    pcStack_828 = (code *)0x10c8dd;
    fVar2 = fdb_kvs_close(pfStack_810);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca3d;
    pfVar22 = (fdb_config *)0x147599;
    pcVar12 = "val";
    do {
      pcStack_828 = (code *)0x10c90d;
      fVar2 = fdb_set_kv(pfStack_820,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c9e8;
      uVar16 = (int)unaff_RBP - 1;
      unaff_RBP = (size_t)uVar16;
    } while (uVar16 != 0);
    pcStack_828 = (code *)0x10c928;
    fVar2 = fdb_commit(pfStack_818,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca44;
    pcStack_828 = (code *)0x10c943;
    fVar2 = fdb_snapshot_open(pfStack_820,&pfStack_810,1);
    if (fVar2 == FDB_RESULT_NO_DB_INSTANCE) {
      pcStack_828 = (code *)0x10c956;
      fVar2 = fdb_free_block(pfStack_808);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca4b;
      pcStack_828 = (code *)0x10c967;
      fVar2 = fdb_kvs_close(pfStack_820);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca52;
      pcStack_828 = (code *)0x10c979;
      fVar2 = fdb_close(pfStack_818);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStack_828 = (code *)0x10c986;
        fdb_shutdown();
        pcStack_828 = (code *)0x10c98b;
        memleak_end();
        pcVar12 = "%s PASSED\n";
        if (snapshot_inmem_before_block_reuse_test()::__test_pass != '\0') {
          pcVar12 = "%s FAILED\n";
        }
        pcStack_828 = (code *)0x10c9bc;
        fprintf(_stderr,pcVar12,"snapshot inmem before block reuse test");
        return;
      }
      goto LAB_0010ca59;
    }
LAB_0010c9ef:
    pcVar12 = "val";
    pfVar22 = (fdb_config *)0x147599;
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010ca01:
      pcStack_828 = (code *)0x10ca06;
      snapshot_inmem_before_block_reuse_test();
      goto LAB_0010ca06;
    }
    pcStack_828 = (code *)0x10c9fd;
    fVar2 = fdb_kvs_close(pfStack_810);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0010ca01;
  }
  else {
LAB_0010ca06:
    pcStack_828 = (code *)0x10ca0d;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca0d:
    pcStack_828 = (code *)0x10ca14;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca14:
    pcStack_828 = (code *)0x10ca1b;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca1b:
    pcStack_828 = (code *)0x10ca22;
    snapshot_inmem_before_block_reuse_test();
    pfVar14 = pfVar22;
LAB_0010ca22:
    pcStack_828 = (code *)0x10ca29;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca29:
    pcStack_828 = (code *)0x10ca2e;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca2e:
    pfVar22 = pfVar14;
    pcStack_828 = (code *)0x10ca35;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca35:
    pcStack_828 = (code *)0x10ca3d;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca3d:
    pcStack_828 = (code *)0x10ca44;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca44:
    pcStack_828 = (code *)0x10ca4b;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca4b:
    pcStack_828 = (code *)0x10ca52;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca52:
    pcStack_828 = (code *)0x10ca59;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca59:
    pcStack_828 = (code *)0x10ca60;
    snapshot_inmem_before_block_reuse_test();
  }
  pcStack_828 = variable_value_size_test;
  snapshot_inmem_before_block_reuse_test();
  aVar24.seqtree = (btree *)0x0;
  pcStack_b10 = (code *)0x10ca87;
  pfStack_850 = pfVar22;
  pfStack_848 = unaff_R12;
  uStack_840 = unaff_R13;
  pfStack_838 = (fdb_config *)pcVar12;
  pfStack_830 = (fdb_file_info *)unaff_R15;
  pcStack_828 = (code *)unaff_RBP;
  gettimeofday(&tStack_ab8,(__timezone_ptr_t)0x0);
  pcStack_b10 = (code *)0x10ca8c;
  memleak_start();
  pcStack_b10 = (code *)0x10ca96;
  pcVar13 = (char *)operator_new__(0x500000);
  pcVar12 = auStack_aa8;
  pcStack_b10 = (code *)0x10caa6;
  fdb_get_default_kvs_config();
  pfVar22 = &fStack_948;
  pcStack_b10 = (code *)0x10cab6;
  fdb_get_default_config();
  fStack_948.compaction_threshold = '\0';
  fStack_948.block_reusing_threshold = 0x41;
  pcStack_b10 = (code *)0x10cad4;
  system("rm -rf  staleblktest* > errorlog.txt");
  handle.seqtree = (btree *)&pfStack_b00;
  pcStack_b10 = (code *)0x10caeb;
  fdb_open((fdb_file_handle **)handle.seqtree,"./staleblktest1",pfVar22);
  pcStack_b10 = (code *)0x10cafa;
  fdb_kvs_open_default(pfStack_b00,(fdb_kvs_handle **)&aStack_b08.seqtree,(fdb_kvs_config *)pcVar12)
  ;
  if (fStack_948.num_keeping_headers != 0xffffffffffffffff) {
    pcVar23 = "%d_key";
    pcVar12 = (char *)&fStack_a48;
    aVar24.seqtree = (btree *)0x0;
    iVar4 = 0;
    do {
      sStack_af8 = CONCAT44(sStack_af8._4_4_,iVar4 + 3);
      pfVar22 = (fdb_config *)0x1ff;
      aStack_af0 = aVar24;
      do {
        pcStack_b10 = (code *)0x10cb40;
        sprintf(pcVar12,"%d_key",(ulong)((int)pfVar22 + 1));
        pcStack_b10 = (code *)0x10cb50;
        memset(pcVar13,0x61,(size_t)pfVar22);
        handle = aStack_b08;
        pcVar13[(long)pfVar22] = '\0';
        pcStack_b10 = (code *)0x10cb61;
        sVar5 = strlen(pcVar12);
        unaff_RBP = sVar5 + 1;
        pcStack_b10 = (code *)0x10cb6d;
        sVar5 = strlen(pcVar13);
        pcStack_b10 = (code *)0x10cb82;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)handle.seqtree,pcVar12,unaff_RBP,pcVar13,sVar5 + 1);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d063;
        pfVar22 = (fdb_config *)&pfVar22[2].wal_threshold;
      } while (pfVar22 != (fdb_config *)0x7ff);
      pcStack_b10 = (code *)0x10cba9;
      fVar2 = fdb_commit(pfStack_b00,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d071;
      aVar24.seqtree = (btree *)&(aStack_af0.seqtree)->vsize;
      iVar4 = (int)sStack_af8;
    } while (aVar24.seqtree < (undefined1 *)(fStack_948.num_keeping_headers + 1));
    aVar24 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)(long)(int)sStack_af8;
  }
  pcStack_b10 = (code *)0x10cbe5;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_b08.seqtree,
                            (fdb_kvs_handle **)&aStack_ad0.seqtree,(fdb_seqnum_t)aVar24);
  sVar19 = unaff_RBP;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    sVar6 = 0xffffffff;
    pcVar12 = "%d_key";
    pfVar22 = &fStack_a48;
    handle.seqtree = (btree *)0x0;
LAB_0010cc04:
    unaff_RBP = 0x3ff;
    sStack_af8 = sVar6;
    aStack_af0 = handle;
LAB_0010cc13:
    pcStack_b10 = (code *)0x10cc23;
    sprintf((char *)pfVar22,"%d_key",(ulong)((int)unaff_RBP + 1));
    pcStack_b10 = (code *)0x10cc33;
    memset(pcVar13,0x62,unaff_RBP);
    handle = aStack_b08;
    pcVar13[unaff_RBP] = '\0';
    pcStack_b10 = (code *)0x10cc43;
    sVar5 = strlen((char *)pfVar22);
    pcVar23 = (char *)(sVar5 + 1);
    pcStack_b10 = (code *)0x10cc4f;
    sVar5 = strlen(pcVar13);
    pcStack_b10 = (code *)0x10cc64;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)handle.seqtree,pfVar22,(size_t)pcVar23,pcVar13,sVar5 + 1);
    if (fVar2 == FDB_RESULT_SUCCESS) goto code_r0x0010cc6c;
    pcStack_b10 = (code *)0x10d063;
    variable_value_size_test();
LAB_0010d063:
    pcStack_b10 = (code *)0x10d06a;
    variable_value_size_test();
    goto LAB_0010d06a;
  }
LAB_0010d086:
  pcStack_b10 = (code *)0x10d08d;
  variable_value_size_test();
LAB_0010d08d:
  pcStack_b10 = (code *)0x10d092;
  variable_value_size_test();
LAB_0010d092:
  pcStack_b10 = (code *)0x10d099;
  variable_value_size_test();
LAB_0010d099:
  pcStack_b10 = (code *)0x10d0a0;
  variable_value_size_test();
LAB_0010d0a0:
  pcStack_b10 = (code *)0x10d0a7;
  variable_value_size_test();
LAB_0010d0a7:
  pcStack_b10 = (code *)0x10d0ae;
  variable_value_size_test();
LAB_0010d0ae:
  pcStack_b10 = (code *)0x10d0b5;
  variable_value_size_test();
LAB_0010d0b5:
  aVar25 = aVar24;
  pcStack_b10 = (code *)0x10d0bc;
  variable_value_size_test();
LAB_0010d0bc:
  pcStack_b10 = (code *)0x10d0c4;
  variable_value_size_test();
LAB_0010d0c4:
  pcStack_b10 = (code *)0x10d0cb;
  variable_value_size_test();
LAB_0010d0cb:
  pcStack_b10 = (code *)0x10d0d2;
  variable_value_size_test();
LAB_0010d0d2:
  pcStack_b10 = (code *)0x10d0da;
  variable_value_size_test();
LAB_0010d0da:
  pcStack_b10 = (code *)0x10d0e1;
  variable_value_size_test();
LAB_0010d0e1:
  pcStack_b10 = (code *)0x10d0e8;
  variable_value_size_test();
LAB_0010d0e8:
  pcStack_b10 = (code *)0x10d0ef;
  variable_value_size_test();
LAB_0010d0ef:
  pcStack_b10 = (code *)0x10d0f6;
  variable_value_size_test();
LAB_0010d0f6:
  pcStack_b10 = rollback_with_num_keeping_headers;
  variable_value_size_test();
  pcStack_11e8 = (code *)0x10d11a;
  pcStack_b38 = pcVar13;
  pfStack_b30 = pfVar22;
  aStack_b28 = handle;
  aStack_b20 = aVar25;
  aStack_b18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar12;
  pcStack_b10 = (code *)sVar19;
  gettimeofday(&tStack_11a0,(__timezone_ptr_t)0x0);
  pcStack_11e8 = (code *)0x10d11f;
  memleak_start();
  pcStack_11e8 = (code *)0x10d12c;
  fdb_get_default_kvs_config();
  pcStack_11e8 = (code *)0x10d13c;
  fdb_get_default_config();
  fStack_c30.compaction_threshold = '\0';
  fStack_c30.block_reusing_threshold = 0x41;
  fStack_c30.num_keeping_headers = 1;
  pcStack_11e8 = (code *)0x10d163;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_11e8 = (code *)0x10d17a;
  fdb_open(&pfStack_11d8,"./staleblktest1",&fStack_c30);
  pcStack_11e8 = (code *)0x10d188;
  fdb_kvs_open_default(pfStack_11d8,&pfStack_11e0,&fStack_1190);
  pcVar15 = "%dkey";
  pcVar13 = acStack_1130;
  pcVar23 = acStack_1030;
  pcVar12 = (char *)0x0;
  do {
    pcStack_11e8 = (code *)0x10d1b0;
    sprintf(pcVar13,"%dkey",pcVar12);
    pcStack_11e8 = (code *)0x10d1c2;
    memset(pcVar23,0x62,0x1ff);
    pfVar20 = pfStack_11e0;
    uStack_e31 = 0;
    pcStack_11e8 = (code *)0x10d1d6;
    sVar7 = strlen(pcVar13);
    pcStack_11e8 = (code *)0x10d1e1;
    sVar5 = strlen(pcVar23);
    pcStack_11e8 = (code *)0x10d1f5;
    fVar2 = fdb_set_kv(pfVar20,pcVar13,sVar7,pcVar23,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010d445:
      pcStack_11e8 = (code *)0x10d44c;
      rollback_with_num_keeping_headers();
      goto LAB_0010d44c;
    }
    pcStack_11e8 = (code *)0x10d20c;
    fVar2 = fdb_commit(pfStack_11d8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_11e8 = (code *)0x10d445;
      rollback_with_num_keeping_headers();
      goto LAB_0010d445;
    }
    uVar16 = (int)pcVar12 + 1;
    pcVar12 = (char *)(ulong)uVar16;
  } while (uVar16 != 10);
  pcVar23 = (char *)0x0;
  pcVar12 = acStack_1130;
  pcVar13 = acStack_1030;
  pcVar15 = (char *)0x0;
  do {
    pfVar20 = pfStack_11e0;
    builtin_strncpy(acStack_1130,"0key",5);
    builtin_strncpy(acStack_1030,
                    "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                    ,0x80);
    pcStack_11e8 = (code *)0x10d29e;
    sVar7 = strlen(pcVar12);
    pcStack_11e8 = (code *)0x10d2a9;
    sVar5 = strlen(pcVar13);
    pcStack_11e8 = (code *)0x10d2bd;
    fVar2 = fdb_set_kv(pfVar20,pcVar12,sVar7,pcVar13,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d453;
    pcStack_11e8 = (code *)0x10d2d4;
    fVar2 = fdb_get_file_info(pfStack_11d8,&fStack_1178);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d44c;
    uVar16 = (int)pcVar15 + 1;
    pcVar15 = (char *)(ulong)uVar16;
  } while (fStack_1178.file_size < 0x1000000);
  pcStack_11e8 = (code *)0x10d2f9;
  sVar3 = sb_check_block_reusing(pfStack_11e0);
  if (sVar3 == SBD_RECLAIM) {
    pcStack_11e8 = (code *)0x10d311;
    fVar2 = fdb_commit(pfStack_11d8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d466;
    pcVar13 = acStack_1130;
    pcVar23 = acStack_1030;
    pcVar12 = (char *)0x0;
    do {
      pcStack_11e8 = (code *)0x10d33e;
      sprintf(pcVar13,"%dkey",pcVar12);
      pcStack_11e8 = (code *)0x10d350;
      memset(pcVar23,100,0x1ff);
      pfVar20 = pfStack_11e0;
      uStack_e31 = 0;
      pcStack_11e8 = (code *)0x10d364;
      sVar7 = strlen(pcVar13);
      pcStack_11e8 = (code *)0x10d36f;
      sVar5 = strlen(pcVar23);
      pcStack_11e8 = (code *)0x10d383;
      fVar2 = fdb_set_kv(pfVar20,pcVar13,sVar7,pcVar23,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d45a;
      uVar21 = (int)pcVar12 + 1;
      pcVar12 = (char *)(ulong)uVar21;
    } while (uVar16 != uVar21);
    pcStack_11e8 = (code *)0x10d39e;
    fVar2 = fdb_rollback(&pfStack_11e0,10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d46d;
    pcStack_11e8 = (code *)0x10d3b4;
    fVar2 = fdb_get_kvs_info(pfStack_11e0,&fStack_11d0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d474;
    if (fStack_11d0.doc_count != 10) {
      pcStack_11e8 = (code *)0x10d3ce;
      rollback_with_num_keeping_headers();
    }
    pcStack_11e8 = (code *)0x10d3d7;
    fVar2 = fdb_kvs_close(pfStack_11e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d47b;
    pcStack_11e8 = (code *)0x10d3e9;
    fVar2 = fdb_close(pfStack_11d8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_11e8 = (code *)0x10d3f6;
      fdb_shutdown();
      pcStack_11e8 = (code *)0x10d3fb;
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (rollback_with_num_keeping_headers()::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pcStack_11e8 = (code *)0x10d42c;
      fprintf(_stderr,pcVar12,"rollback with num keeping headers");
      return;
    }
  }
  else {
LAB_0010d461:
    pcStack_11e8 = (code *)0x10d466;
    rollback_with_num_keeping_headers();
LAB_0010d466:
    pcStack_11e8 = (code *)0x10d46d;
    rollback_with_num_keeping_headers();
LAB_0010d46d:
    pcStack_11e8 = (code *)0x10d474;
    rollback_with_num_keeping_headers();
LAB_0010d474:
    pcStack_11e8 = (code *)0x10d47b;
    rollback_with_num_keeping_headers();
LAB_0010d47b:
    pcStack_11e8 = (code *)0x10d482;
    rollback_with_num_keeping_headers();
  }
  pcStack_11e8 = crash_and_recover_with_num_keeping_test;
  rollback_with_num_keeping_headers();
  pcStack_16d0 = (code *)0x10d4a6;
  fStack_1408.bub_ctx.space_used = (uint64_t)pcVar15;
  sStack_1200 = sVar7;
  pcStack_11f8 = pcVar13;
  pcStack_11f0 = pcVar23;
  pcStack_11e8 = (code *)pcVar12;
  gettimeofday(&tStack_1690,(__timezone_ptr_t)0x0);
  pcStack_16d0 = (code *)0x10d4ab;
  memleak_start();
  pcStack_16d0 = (code *)0x10d4b8;
  fdb_get_default_kvs_config();
  pcStack_16d0 = (code *)0x10d4c8;
  fdb_get_default_config();
  fStack_1408.config.block_reusing_threshold._7_1_ = 0;
  fStack_1408.max_seqnum = 0x41;
  fStack_1408.handle_busy.super___atomic_base<unsigned_char>._M_i =
       (__atomic_base<unsigned_char>)0xa;
  fStack_1408.dirty_updates = '\0';
  fStack_1408._466_6_ = 0;
  pcStack_16d0 = (code *)0x10d4ef;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_16d0 = (code *)0x10d506;
  fdb_open(&pfStack_16c0,"./staleblktest1file.1",(fdb_config *)&fStack_1408.config.encryption_key);
  pcStack_16d0 = (code *)0x10d51b;
  fdb_kvs_open(pfStack_16c0,&pfStack_16c8,"./staleblktest1",&fStack_16a8);
  pcVar13 = "%dkey";
  pfVar20 = &fStack_1408;
  pfVar10 = (fdb_kvs_handle *)auStack_1608;
  pcVar12 = (char *)0x0;
  do {
    pcStack_16d0 = (code *)0x10d543;
    sprintf((char *)pfVar20,"%dkey",pcVar12);
    pcStack_16d0 = (code *)0x10d555;
    memset(pfVar10,0x62,0x1ff);
    pfVar9 = pfStack_16c8;
    auStack_1608[0x1ff] = 0;
    pcStack_16d0 = (code *)0x10d569;
    pfVar8 = (fdb_kvs_handle *)strlen((char *)pfVar20);
    pcStack_16d0 = (code *)0x10d574;
    sVar5 = strlen((char *)pfVar10);
    pcStack_16d0 = (code *)0x10d588;
    fVar2 = fdb_set_kv(pfVar9,pfVar20,(size_t)pfVar8,pfVar10,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010d9e8:
      pcStack_16d0 = (code *)0x10d9ef;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010d9ef;
    }
    pcStack_16d0 = (code *)0x10d59f;
    fVar2 = fdb_commit(pfStack_16c0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_16d0 = (code *)0x10d9e8;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010d9e8;
    }
    uVar16 = (int)pcVar12 + 1;
    pcVar12 = (char *)(ulong)uVar16;
  } while (uVar16 != 0xb);
  pfVar10 = (fdb_kvs_handle *)0x0;
  pcVar13 = (char *)&fStack_1408;
  pcVar12 = auStack_1608;
  pfVar20 = (fdb_kvs_handle *)0x0;
  do {
    pfVar9 = pfStack_16c8;
    fStack_1408.kvs_config._4_1_ = 0;
    fStack_1408.kvs_config.create_if_missing = true;
    fStack_1408.kvs_config._1_3_ = 0x79656b;
    auStack_1608._0_8_ = 0x6363636363636363;
    auStack_1608._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_1608._16_8_ = (void *)0x6363636363636363;
    auStack_1608._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_1608._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_1608._40_7_ = 0x63636363636363;
    auStack_1608[0x2f] = 99;
    auStack_1608._48_7_ = 0x63636363636363;
    auStack_1608[0x37] = 99;
    auStack_1608._56_7_ = 0x63636363636363;
    auStack_1608[0x3f] = 99;
    auStack_1608._64_8_ = (btree *)0x6363636363636363;
    auStack_1608._72_8_ = (filemgr *)0x6363636363636363;
    auStack_1608._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_1608._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_1608._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_1608._104_7_ = 0x63636363636363;
    auStack_1608[0x6f] = 99;
    auStack_1608._112_7_ = 0x63636363636363;
    auStack_1608._119_8_ = 0x6363636363636363;
    auStack_1608[0x7f] = 0;
    pcStack_16d0 = (code *)0x10d632;
    pfVar8 = (fdb_kvs_handle *)strlen(pcVar13);
    pcStack_16d0 = (code *)0x10d63d;
    sVar5 = strlen(pcVar12);
    pcStack_16d0 = (code *)0x10d651;
    fVar2 = fdb_set_kv(pfVar9,pcVar13,(size_t)pfVar8,pcVar12,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d9f6;
    pcStack_16d0 = (code *)0x10d668;
    fVar2 = fdb_get_file_info(pfStack_16c0,&fStack_1680);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d9ef;
    pfVar20 = (fdb_kvs_handle *)(ulong)((int)pfVar20 + 1);
  } while (fStack_1680.file_size < 0x1000000);
  pcStack_16d0 = (code *)0x10d68b;
  sVar3 = sb_check_block_reusing(pfStack_16c8);
  if (sVar3 == SBD_RECLAIM) {
    pcStack_16d0 = (code *)0x10d6a3;
    fVar2 = fdb_commit(pfStack_16c0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da25;
    pcStack_16d0 = (code *)0x10d6bc;
    fVar2 = fdb_get_kvs_info(pfStack_16c8,&fStack_1638);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da2c;
    pfStack_16b8 = (fdb_kvs_handle *)fStack_1638.last_seqnum;
    pfVar10 = &fStack_1408;
    pfVar9 = (fdb_kvs_handle *)auStack_1608;
    pcVar12 = (char *)0x0;
    do {
      pcStack_16d0 = (code *)0x10d6f6;
      sprintf((char *)pfVar10,"%dkey",pcVar12);
      pfVar8 = pfStack_16c8;
      auStack_1608._0_8_ = 0x6464646464646464;
      auStack_1608._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
      auStack_1608._16_8_ = (void *)0x6464646464646464;
      auStack_1608._24_8_ = (kvs_info *)0x6464646464646464;
      auStack_1608._32_8_ = (kvs_ops_stat *)0x6464646464646464;
      auStack_1608._40_7_ = 0x64646464646464;
      auStack_1608[0x2f] = 100;
      auStack_1608._48_7_ = 0x64646464646464;
      auStack_1608[0x37] = 100;
      auStack_1608._56_7_ = 0x64646464646464;
      auStack_1608[0x3f] = 0;
      pcStack_16d0 = (code *)0x10d731;
      pcVar13 = (char *)strlen((char *)pfVar10);
      pcStack_16d0 = (code *)0x10d73c;
      sVar5 = strlen((char *)pfVar9);
      pcStack_16d0 = (code *)0x10d750;
      fVar2 = fdb_set_kv(pfVar8,pfVar10,(size_t)pcVar13,pfVar9,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da04;
      pcStack_16d0 = (code *)0x10d767;
      fVar2 = fdb_commit(pfStack_16c0,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d9fd;
      uVar16 = (int)pcVar12 + 1;
      pcVar12 = (char *)(ulong)uVar16;
    } while (uVar16 != 10);
    pcStack_16d0 = (code *)0x10d783;
    fVar2 = fdb_kvs_close(pfStack_16c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da33;
    pcStack_16d0 = (code *)0x10d795;
    fVar2 = fdb_close(pfStack_16c0);
    pcVar13 = (char *)pfStack_16b8;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da3a;
    pcStack_16d0 = (code *)0x10d7a7;
    fdb_shutdown();
    pcStack_16d0 = (code *)0x10d7c0;
    fVar2 = fdb_open(&pfStack_16c0,"./staleblktest1file.1",
                     (fdb_config *)&fStack_1408.config.encryption_key);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da41;
    pcStack_16d0 = (code *)0x10d7e1;
    fdb_kvs_open(pfStack_16c0,&pfStack_16c8,"./staleblktest1",&fStack_16a8);
    pcStack_16d0 = (code *)0x10d7f0;
    fVar2 = fdb_get_file_info(pfStack_16c0,&fStack_1680);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da48;
    pcStack_16d0 = (code *)0x10d818;
    iVar4 = _disk_dump("./staleblktest1file.1",fStack_1680.file_size,
                       (ulong)(((uint)fStack_1408.config.encryption_key.bytes._0_4_ >> 2) +
                              fStack_1408.config.encryption_key.bytes._0_4_ * 2));
    if (iVar4 < 0) goto LAB_0010da4f;
    pcStack_16d0 = (code *)0x10d831;
    fVar2 = fdb_snapshot_open(pfStack_16c8,&pfStack_16b0,(fdb_seqnum_t)pcVar13);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da54;
    pcStack_16d0 = (code *)0x10d844;
    fVar2 = fdb_rollback(&pfStack_16c8,(fdb_seqnum_t)pcVar13);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da5b;
    pcStack_16d0 = (code *)0x10d85d;
    fVar2 = fdb_compact(pfStack_16c0,"./staleblktest1file.3");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da62;
    pcVar13 = "%dkey";
    pfVar9 = &fStack_1408;
    pcVar12 = (char *)0x0;
    do {
      pcStack_16d0 = (code *)0x10d885;
      sprintf((char *)pfVar9,"%dkey",pcVar12);
      pfVar10 = pfStack_16c8;
      pcStack_16d0 = (code *)0x10d891;
      sVar5 = strlen((char *)pfVar9);
      pcStack_16d0 = (code *)0x10d89f;
      fVar2 = fdb_del_kv(pfVar10,pfVar9,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da12;
      pcStack_16d0 = (code *)0x10d8b6;
      fVar2 = fdb_commit(pfStack_16c0,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da0b;
      uVar16 = (int)pcVar12 + 1;
      pcVar12 = (char *)(ulong)uVar16;
    } while (uVar16 != 0xb);
    pcStack_16d0 = (code *)0x10d8ce;
    sVar3 = sb_check_block_reusing(pfStack_16c8);
    if (sVar3 != SBD_NONE) goto LAB_0010da69;
    pcVar12 = (char *)0x0;
    pcVar13 = auStack_1608;
    pfVar8 = &fStack_1408;
    do {
      fStack_1408.kvs_config._4_1_ = 0;
      fStack_1408.kvs_config.create_if_missing = true;
      fStack_1408.kvs_config._1_3_ = 0x79656b;
      pcStack_16d0 = (code *)0x10d90d;
      memset(pcVar13,0x65,0x1ff);
      pfVar10 = pfStack_16c8;
      auStack_1608[0x1ff] = 0;
      pcStack_16d0 = (code *)0x10d921;
      pfVar9 = (fdb_kvs_handle *)strlen((char *)pfVar8);
      pcStack_16d0 = (code *)0x10d92c;
      sVar5 = strlen(pcVar13);
      pcStack_16d0 = (code *)0x10d940;
      fVar2 = fdb_set_kv(pfVar10,pfVar8,(size_t)pfVar9,pcVar13,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da19;
      uVar16 = (int)pfVar20 - 1;
      pfVar20 = (fdb_kvs_handle *)(ulong)uVar16;
    } while (uVar16 != 0);
    pcStack_16d0 = (code *)0x10d956;
    sVar3 = sb_check_block_reusing(pfStack_16c8);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010da6e;
    pcStack_16d0 = (code *)0x10d969;
    fVar2 = fdb_kvs_close(pfStack_16b0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da73;
    pcStack_16d0 = (code *)0x10d97a;
    fVar2 = fdb_kvs_close(pfStack_16c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da7a;
    pcStack_16d0 = (code *)0x10d98c;
    fVar2 = fdb_close(pfStack_16c0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_16d0 = (code *)0x10d999;
      fdb_shutdown();
      pcStack_16d0 = (code *)0x10d99e;
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (crash_and_recover_with_num_keeping_test()::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pcStack_16d0 = (code *)0x10d9cf;
      fprintf(_stderr,pcVar12,"crash and recover with num keeping test");
      return;
    }
  }
  else {
LAB_0010da20:
    pcStack_16d0 = (code *)0x10da25;
    crash_and_recover_with_num_keeping_test();
LAB_0010da25:
    pcStack_16d0 = (code *)0x10da2c;
    crash_and_recover_with_num_keeping_test();
LAB_0010da2c:
    pcStack_16d0 = (code *)0x10da33;
    crash_and_recover_with_num_keeping_test();
LAB_0010da33:
    pcStack_16d0 = (code *)0x10da3a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da3a:
    pcStack_16d0 = (code *)0x10da41;
    crash_and_recover_with_num_keeping_test();
LAB_0010da41:
    pcStack_16d0 = (code *)0x10da48;
    crash_and_recover_with_num_keeping_test();
LAB_0010da48:
    pcStack_16d0 = (code *)0x10da4f;
    crash_and_recover_with_num_keeping_test();
LAB_0010da4f:
    pcStack_16d0 = (code *)0x10da54;
    crash_and_recover_with_num_keeping_test();
LAB_0010da54:
    pcStack_16d0 = (code *)0x10da5b;
    crash_and_recover_with_num_keeping_test();
LAB_0010da5b:
    pcStack_16d0 = (code *)0x10da62;
    crash_and_recover_with_num_keeping_test();
LAB_0010da62:
    pcStack_16d0 = (code *)0x10da69;
    crash_and_recover_with_num_keeping_test();
LAB_0010da69:
    pcStack_16d0 = (code *)0x10da6e;
    crash_and_recover_with_num_keeping_test();
LAB_0010da6e:
    pcStack_16d0 = (code *)0x10da73;
    crash_and_recover_with_num_keeping_test();
LAB_0010da73:
    pcStack_16d0 = (code *)0x10da7a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da7a:
    pcStack_16d0 = (code *)0x10da81;
    crash_and_recover_with_num_keeping_test();
  }
  pcStack_16d0 = reuse_on_delete_test;
  crash_and_recover_with_num_keeping_test();
  pfStack_1b78 = (fdb_kvs_handle *)0x10daa5;
  pfStack_16f8 = (fdb_kvs_handle *)pcVar13;
  pfStack_16f0 = pfVar9;
  pfStack_16e8 = pfVar8;
  pfStack_16e0 = pfVar20;
  pfStack_16d8 = pfVar10;
  pcStack_16d0 = (code *)pcVar12;
  gettimeofday(&tStack_1b60,(__timezone_ptr_t)0x0);
  pfStack_1b78 = (fdb_kvs_handle *)0x10daaa;
  memleak_start();
  pfStack_1b78 = (fdb_kvs_handle *)0x10daba;
  fdb_get_default_kvs_config();
  pfStack_1b78 = (fdb_kvs_handle *)0x10daca;
  fdb_get_default_config();
  uStack_17c1 = 0;
  pfStack_1738 = (fdb_kvs_handle *)0x41;
  uStack_1720 = 10;
  pfStack_1b78 = (fdb_kvs_handle *)0x10daf1;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_1b78 = (fdb_kvs_handle *)0x10db08;
  fdb_open(&pfStack_1b68,"./staleblktest1",(fdb_config *)(auStack_1938 + 0x148));
  pfStack_1b78 = (fdb_kvs_handle *)0x10db16;
  fdb_kvs_open_default(pfStack_1b68,&pfStack_1b70,(fdb_kvs_config *)(auStack_1b50 + 0x200));
  pcVar23 = "%dkey";
  pcVar13 = auStack_1938 + 0x48;
  pcVar12 = auStack_1b50;
  pfVar20 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1b78 = (fdb_kvs_handle *)0x10db3b;
    sprintf(pcVar13,"%dkey",pfVar20);
    pfStack_1b78 = (fdb_kvs_handle *)0x10db4d;
    memset(pcVar12,0x62,0x1ff);
    pfVar10 = pfStack_1b70;
    auStack_1b50[0x1ff] = 0;
    pfStack_1b78 = (fdb_kvs_handle *)0x10db61;
    pfVar9 = (fdb_kvs_handle *)strlen(pcVar13);
    pfStack_1b78 = (fdb_kvs_handle *)0x10db6c;
    sVar5 = strlen(pcVar12);
    pfStack_1b78 = (fdb_kvs_handle *)0x10db80;
    fVar2 = fdb_set_kv(pfVar10,pcVar13,(size_t)pfVar9,pcVar12,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010de19:
      pfStack_1b78 = (fdb_kvs_handle *)0x10de20;
      reuse_on_delete_test();
      goto LAB_0010de20;
    }
    pfStack_1b78 = (fdb_kvs_handle *)0x10db97;
    fVar2 = fdb_commit(pfStack_1b68,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_1b78 = (fdb_kvs_handle *)0x10de19;
      reuse_on_delete_test();
      goto LAB_0010de19;
    }
    uVar16 = (int)pfVar20 + 1;
    pfVar20 = (fdb_kvs_handle *)(ulong)uVar16;
  } while (uVar16 != 0xb);
  pcVar12 = auStack_1938 + 0x48;
  pfVar10 = (fdb_kvs_handle *)auStack_1b50;
  pfVar9 = (fdb_kvs_handle *)auStack_1938;
  pcVar23 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfVar8 = (fdb_kvs_handle *)pcVar23;
    pfStack_1b78 = (fdb_kvs_handle *)0x10dbd0;
    sprintf(pcVar12,"%dkey",pfVar8);
    pfVar20 = pfStack_1b70;
    auStack_1b50._0_8_ = 0x6363636363636363;
    auStack_1b50._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_1b50._16_8_ = (void *)0x6363636363636363;
    auStack_1b50._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_1b50._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_1b50._40_8_ = (fdb_file_handle *)0x6363636363636363;
    auStack_1b50._48_8_ = (hbtrie *)0x6363636363636363;
    auStack_1b50._56_8_ = (btree *)0x6363636363636363;
    auStack_1b50._64_8_ = (btree *)0x6363636363636363;
    auStack_1b50._72_8_ = (filemgr *)0x6363636363636363;
    auStack_1b50._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_1b50._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_1b50._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_1b50._104_7_ = 0x63636363636363;
    auStack_1b50[0x6f] = 99;
    auStack_1b50._112_7_ = 0x63636363636363;
    auStack_1b50._119_8_ = 0x6363636363636363;
    auStack_1b50[0x7f] = 0;
    pfStack_1b78 = (fdb_kvs_handle *)0x10dc19;
    pcVar13 = (char *)strlen(pcVar12);
    pfStack_1b78 = (fdb_kvs_handle *)0x10dc24;
    sVar5 = strlen((char *)pfVar10);
    pfStack_1b78 = (fdb_kvs_handle *)0x10dc38;
    fVar2 = fdb_set_kv(pfVar20,pcVar12,(size_t)pcVar13,pfVar10,sVar5);
    pcVar23 = (char *)pfVar8;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de27;
    pfStack_1b78 = (fdb_kvs_handle *)0x10dc4d;
    fVar2 = fdb_get_file_info(pfStack_1b68,(fdb_file_info *)pfVar9);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de20;
    uVar16 = (uint)pfVar8 + 1;
    pcVar23 = (char *)(ulong)uVar16;
  } while ((ulong)auStack_1938._40_8_ < (fdb_file_handle *)0x1000000);
  pfStack_1b78 = (fdb_kvs_handle *)0x10dc72;
  sVar3 = sb_check_block_reusing(pfStack_1b70);
  if (sVar3 == SBD_NONE) {
    pfStack_1b78 = (fdb_kvs_handle *)0x10dc89;
    fVar2 = fdb_commit(pfStack_1b68,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de41;
    pcVar13 = "%dkey";
    pcVar12 = auStack_1938 + 0x48;
    pfVar20 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_1b78 = (fdb_kvs_handle *)0x10dcb5;
      sprintf(pcVar12,"%dkey",pfVar20);
      pfVar10 = pfStack_1b70;
      pfStack_1b78 = (fdb_kvs_handle *)0x10dcc1;
      sVar5 = strlen(pcVar12);
      pfStack_1b78 = (fdb_kvs_handle *)0x10dccf;
      fVar2 = fdb_del_kv(pfVar10,pcVar12,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de2e;
      uVar21 = (int)pfVar20 + 1;
      pfVar20 = (fdb_kvs_handle *)(ulong)uVar21;
    } while (uVar16 != uVar21);
    pfStack_1b78 = (fdb_kvs_handle *)0x10dce6;
    sVar3 = sb_check_block_reusing(pfStack_1b70);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010de48;
    if (2 < (uint)pfVar8) {
      pcVar23 = (char *)(ulong)(uVar16 >> 2);
      pcVar12 = auStack_1938 + 0x48;
      pfVar10 = (fdb_kvs_handle *)auStack_1b50;
      pfVar20 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_1b78 = (fdb_kvs_handle *)0x10dd1e;
        sprintf(pcVar12,"%dkey",pfVar20);
        pfVar8 = pfStack_1b70;
        auStack_1b50._0_8_ = 0x6464646464646464;
        auStack_1b50._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
        auStack_1b50._16_8_ = (void *)0x6464646464646464;
        auStack_1b50._24_8_ = (kvs_info *)0x6464646464646464;
        auStack_1b50._32_8_ = (kvs_ops_stat *)0x6464646464646464;
        auStack_1b50._40_8_ = (fdb_file_handle *)0x6464646464646464;
        auStack_1b50._48_8_ = (hbtrie *)0x6464646464646464;
        auStack_1b50._56_8_ = (btree *)0x6464646464646464;
        auStack_1b50._64_8_ = (btree *)0x6464646464646464;
        auStack_1b50._72_8_ = (filemgr *)0x6464646464646464;
        auStack_1b50._80_8_ = (docio_handle *)0x6464646464646464;
        auStack_1b50._88_8_ = (btreeblk_handle *)0x6464646464646464;
        auStack_1b50._96_8_ = (btree_blk_ops *)0x6464646464646464;
        auStack_1b50._104_7_ = 0x64646464646464;
        auStack_1b50[0x6f] = 100;
        auStack_1b50._112_7_ = 0x64646464646464;
        auStack_1b50._119_8_ = 0x6464646464646464;
        auStack_1b50[0x7f] = 0;
        pfStack_1b78 = (fdb_kvs_handle *)0x10dd67;
        pcVar13 = (char *)strlen(pcVar12);
        pfStack_1b78 = (fdb_kvs_handle *)0x10dd72;
        sVar5 = strlen((char *)pfVar10);
        pfStack_1b78 = (fdb_kvs_handle *)0x10dd86;
        fVar2 = fdb_set_kv(pfVar8,pcVar12,(size_t)pcVar13,pfVar10,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de35;
        uVar21 = (int)pfVar20 + 2;
        pfVar20 = (fdb_kvs_handle *)(ulong)uVar21;
      } while (uVar21 < uVar16 >> 2);
    }
    pcVar12 = auStack_1938 + 0x48;
    pfStack_1b78 = (fdb_kvs_handle *)0x10dda2;
    sVar3 = sb_check_block_reusing(pfStack_1b70);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010de4d;
    pfStack_1b78 = (fdb_kvs_handle *)0x10ddb5;
    fVar2 = fdb_close(pfStack_1b68);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de52;
    pfStack_1b78 = (fdb_kvs_handle *)0x10ddc2;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_1b78 = (fdb_kvs_handle *)0x10ddcf;
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (reuse_on_delete_test()::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pfStack_1b78 = (fdb_kvs_handle *)0x10de00;
      fprintf(_stderr,pcVar12,"reuse on delete test");
      return;
    }
  }
  else {
LAB_0010de3c:
    pfStack_1b78 = (fdb_kvs_handle *)0x10de41;
    reuse_on_delete_test();
LAB_0010de41:
    pfVar8 = pfVar9;
    pfStack_1b78 = (fdb_kvs_handle *)0x10de48;
    reuse_on_delete_test();
LAB_0010de48:
    pfStack_1b78 = (fdb_kvs_handle *)0x10de4d;
    reuse_on_delete_test();
LAB_0010de4d:
    pfStack_1b78 = (fdb_kvs_handle *)0x10de52;
    reuse_on_delete_test();
LAB_0010de52:
    pfStack_1b78 = (fdb_kvs_handle *)0x10de59;
    reuse_on_delete_test();
  }
  pfStack_1b78 = (fdb_kvs_handle *)fragmented_reuse_test;
  reuse_on_delete_test();
  pfStack_2060 = (fdb_kvs_handle *)0x10de7d;
  fStack_1d98.bub_ctx.space_used = (uint64_t)pcVar23;
  fStack_1d98.bub_ctx.handle = pfVar10;
  pfStack_1b90 = pfVar8;
  pcStack_1b88 = pcVar13;
  pcStack_1b80 = pcVar12;
  pfStack_1b78 = pfVar20;
  gettimeofday(&tStack_2008,(__timezone_ptr_t)0x0);
  pfStack_2060 = (fdb_kvs_handle *)0x10de82;
  memleak_start();
  pfStack_2060 = (fdb_kvs_handle *)0x10de8f;
  fdb_get_default_kvs_config();
  pfStack_2060 = (fdb_kvs_handle *)0x10de9f;
  fdb_get_default_config();
  fStack_1d98.config.block_reusing_threshold._7_1_ = 0;
  fStack_1d98.max_seqnum = 0x23;
  fStack_1d98.handle_busy.super___atomic_base<unsigned_char>._M_i =
       (__atomic_base<unsigned_char>)0xa;
  fStack_1d98.dirty_updates = '\0';
  fStack_1d98._466_6_ = 0;
  pfStack_2060 = (fdb_kvs_handle *)0x10dec6;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_2060 = (fdb_kvs_handle *)0x10dedd;
  fdb_open(&pfStack_2048,"./staleblktest1",(fdb_config *)&fStack_1d98.config.encryption_key);
  pfStack_2060 = (fdb_kvs_handle *)0x10deed;
  fdb_kvs_open_default(pfStack_2048,&pfStack_2050,&fStack_1ff8);
  pcVar23 = "%dkey";
  pcVar12 = (char *)&fStack_1d98;
  pcVar13 = auStack_1fe0 + 0x48;
  pfVar20 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_2060 = (fdb_kvs_handle *)0x10df15;
    sprintf(pcVar12,"%dkey",pfVar20);
    pfStack_2060 = (fdb_kvs_handle *)0x10df27;
    memset(pcVar13,0x61,0x1ff);
    pfVar9 = pfStack_2050;
    uStack_1d99 = 0;
    pfStack_2060 = (fdb_kvs_handle *)0x10df3c;
    pfVar10 = (fdb_kvs_handle *)strlen(pcVar12);
    pfStack_2060 = (fdb_kvs_handle *)0x10df47;
    sVar5 = strlen(pcVar13);
    pfStack_2060 = (fdb_kvs_handle *)0x10df5b;
    fVar2 = fdb_set_kv(pfVar9,pcVar12,(size_t)pfVar10,pcVar13,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010e2c3:
      pfStack_2060 = (fdb_kvs_handle *)0x10e2ca;
      fragmented_reuse_test();
      goto LAB_0010e2ca;
    }
    pfStack_2060 = (fdb_kvs_handle *)0x10df72;
    fVar2 = fdb_commit(pfStack_2048,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_2060 = (fdb_kvs_handle *)0x10e2c3;
      fragmented_reuse_test();
      goto LAB_0010e2c3;
    }
    uVar16 = (int)pfVar20 + 1;
    pfVar20 = (fdb_kvs_handle *)(ulong)uVar16;
  } while (uVar16 != 0xb);
  pcVar13 = (char *)&fStack_1d98;
  pfVar9 = (fdb_kvs_handle *)(auStack_1fe0 + 0x48);
  pfVar10 = (fdb_kvs_handle *)auStack_1fe0;
  pcVar23 = (char *)0x0;
  do {
    uVar16 = (uint)pcVar23;
    pfStack_2060 = (fdb_kvs_handle *)0x10dfab;
    sprintf(pcVar13,"%dkey",pcVar23);
    pfVar20 = pfStack_2050;
    auStack_1fe0._72_8_ = (filemgr *)0x6262626262626262;
    pdStack_1f90 = (docio_handle *)0x6262626262626262;
    pbStack_1f88 = (btreeblk_handle *)0x6262626262626262;
    pbStack_1f80 = (btree_blk_ops *)0x6262626262626262;
    pfStack_1f78 = (filemgr_ops *)0x6262626262626262;
    fStack_1f70.chunksize = 0x6262;
    fStack_1f70._2_2_ = 0x6262;
    fStack_1f70.blocksize = 0x62626262;
    fStack_1f70.buffercache_size = 0x6262626262626262;
    fStack_1f70.wal_threshold = 0x6262626262626262;
    fStack_1f70.wal_flush_before_commit = true;
    fStack_1f70.auto_commit = true;
    fStack_1f70._26_2_ = 0x6262;
    fStack_1f70.purging_interval = 0x62626262;
    fStack_1f70.seqtree_opt = 'b';
    fStack_1f70.durability_opt = 'b';
    fStack_1f70._34_2_ = 0x6262;
    fStack_1f70.flags = 0x62626262;
    fStack_1f70.compaction_buf_maxsize = 0x62626262;
    fStack_1f70.cleanup_cache_onclose = true;
    fStack_1f70.compress_document_body = true;
    fStack_1f70.compaction_mode = 'b';
    fStack_1f70.compaction_threshold = 'b';
    fStack_1f70.compaction_minimum_filesize = 0x6262626262626262;
    fStack_1f70.compactor_sleep_duration = 0x6262626262626262;
    fStack_1f70.multi_kv_instances = true;
    fStack_1f70._65_6_ = 0x626262626262;
    fStack_1f70._71_1_ = 0x62;
    fStack_1f70.prefetch_duration._0_7_ = 0x62626262626262;
    fStack_1f70._79_8_ = 0x6262626262626262;
    fStack_1f70._87_1_ = 0;
    pfStack_2060 = (fdb_kvs_handle *)0x10e007;
    pcVar12 = (char *)strlen(pcVar13);
    pfStack_2060 = (fdb_kvs_handle *)0x10e012;
    sVar5 = strlen((char *)pfVar9);
    pfStack_2060 = (fdb_kvs_handle *)0x10e026;
    fVar2 = fdb_set_kv(pfVar20,pcVar13,(size_t)pcVar12,pfVar9,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2d1;
    pfStack_2060 = (fdb_kvs_handle *)0x10e03b;
    fVar2 = fdb_get_file_info(pfStack_2048,(fdb_file_info *)pfVar10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2ca;
    uVar21 = uVar16 + 1;
    pcVar23 = (char *)(ulong)uVar21;
  } while ((ulong)auStack_1fe0._40_8_ < (fdb_file_handle *)0x1000000);
  uStack_203c = uVar16;
  if (2 < uVar16) {
    uVar16 = (uVar21 >> 2) + (uint)(uVar21 >> 2 == 0);
    pfVar10 = (fdb_kvs_handle *)(ulong)uVar16;
    pcVar12 = "%dkey";
    pcVar13 = (char *)&fStack_1d98;
    pfVar20 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_2060 = (fdb_kvs_handle *)0x10e092;
      sprintf(pcVar13,"%dkey",pfVar20);
      pfVar9 = pfStack_2050;
      pfStack_2060 = (fdb_kvs_handle *)0x10e09f;
      sVar5 = strlen(pcVar13);
      pfStack_2060 = (fdb_kvs_handle *)0x10e0ad;
      fVar2 = fdb_del_kv(pfVar9,pcVar13,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2df;
      uVar17 = (int)pfVar20 + 1;
      pfVar20 = (fdb_kvs_handle *)(ulong)uVar17;
    } while (uVar16 != uVar17);
  }
  pcVar13 = (char *)&fStack_1d98;
  pfStack_2060 = (fdb_kvs_handle *)0x10e0c6;
  sVar3 = sb_check_block_reusing(pfStack_2050);
  if (sVar3 == SBD_NONE) {
    pcVar13 = (char *)(pfStack_2050->file->pos).super___atomic_base<unsigned_long>._M_i;
    pfStack_2060 = (fdb_kvs_handle *)0x10e0ec;
    fVar2 = fdb_compact(pfStack_2048,"staleblktest_compact");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2f9;
    pfStack_2060 = (fdb_kvs_handle *)0x10e103;
    fVar2 = fdb_get_kvs_info(pfStack_2050,&fStack_2038);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e300;
    if (fStack_2038.doc_count == 0) {
      pfStack_2060 = (fdb_kvs_handle *)0x10e11d;
      fragmented_reuse_test();
    }
    pcVar12 = (char *)(ulong)(uVar21 >> 2);
    if (pcVar13 <=
        (fdb_kvs_handle *)(pfStack_2050->file->pos).super___atomic_base<unsigned_long>._M_i) {
      pfStack_2060 = (fdb_kvs_handle *)0x10e143;
      fragmented_reuse_test();
    }
    uVar16 = uVar21 >> 1;
    pfVar20 = (fdb_kvs_handle *)(ulong)uVar16;
    if (uVar21 >> 2 < uVar16) {
      pcVar13 = "%dkey";
      pfVar9 = &fStack_1d98;
      do {
        pfStack_2060 = (fdb_kvs_handle *)0x10e16b;
        sprintf((char *)pfVar9,"%dkey",pcVar12);
        pfVar10 = pfStack_2050;
        pfStack_2060 = (fdb_kvs_handle *)0x10e178;
        sVar5 = strlen((char *)pfVar9);
        pfStack_2060 = (fdb_kvs_handle *)0x10e186;
        fVar2 = fdb_del_kv(pfVar10,pfVar9,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2e6;
        uVar17 = (int)pcVar12 + 1;
        pcVar12 = (char *)(ulong)uVar17;
      } while (uVar17 < uVar16);
    }
    pfStack_2060 = (fdb_kvs_handle *)0x10e1a0;
    sVar3 = sb_check_block_reusing(pfStack_2050);
    if (sVar3 != SBD_NONE) goto LAB_0010e307;
    if (uVar16 <= uStack_203c) {
      pcVar12 = "%dkey";
      pcVar13 = (char *)&fStack_1d98;
      do {
        pfStack_2060 = (fdb_kvs_handle *)0x10e1cc;
        sprintf(pcVar13,"%dkey",pfVar20);
        pfVar9 = pfStack_2050;
        pfStack_2060 = (fdb_kvs_handle *)0x10e1d9;
        sVar5 = strlen(pcVar13);
        pfStack_2060 = (fdb_kvs_handle *)0x10e1e7;
        fVar2 = fdb_del_kv(pfVar9,pcVar13,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2ed;
        uVar16 = (int)pfVar20 + 1;
        pfVar20 = (fdb_kvs_handle *)(ulong)uVar16;
      } while (uVar21 != uVar16);
    }
    pcVar23 = (char *)0xb;
    do {
      pfStack_2060 = (fdb_kvs_handle *)0x10e209;
      fVar2 = fdb_commit(pfStack_2048,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2d8;
      uVar16 = (int)pcVar23 - 1;
      pcVar23 = (char *)(ulong)uVar16;
    } while (uVar16 != 0);
    pfStack_2060 = (fdb_kvs_handle *)0x10e224;
    fVar2 = fdb_get_kvs_info(pfStack_2050,&fStack_2038);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e30c;
    pfStack_2060 = (fdb_kvs_handle *)0x10e236;
    sVar3 = sb_check_block_reusing(pfStack_2050);
    if (sVar3 == SBD_NONE) goto LAB_0010e313;
    pfStack_2060 = (fdb_kvs_handle *)0x10e24d;
    fVar2 = fdb_commit(pfStack_2048,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e318;
    pfStack_2060 = (fdb_kvs_handle *)0x10e25f;
    fVar2 = fdb_close(pfStack_2048);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e31f;
    pfStack_2060 = (fdb_kvs_handle *)0x10e26c;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_2060 = (fdb_kvs_handle *)0x10e279;
      memleak_end();
      pcVar12 = "%s PASSED\n";
      if (fragmented_reuse_test()::__test_pass != '\0') {
        pcVar12 = "%s FAILED\n";
      }
      pfStack_2060 = (fdb_kvs_handle *)0x10e2aa;
      fprintf(_stderr,pcVar12,"fragmented reuse test");
      return;
    }
  }
  else {
LAB_0010e2f4:
    pfStack_2060 = (fdb_kvs_handle *)0x10e2f9;
    fragmented_reuse_test();
LAB_0010e2f9:
    pfStack_2060 = (fdb_kvs_handle *)0x10e300;
    fragmented_reuse_test();
LAB_0010e300:
    pfStack_2060 = (fdb_kvs_handle *)0x10e307;
    fragmented_reuse_test();
LAB_0010e307:
    pfStack_2060 = (fdb_kvs_handle *)0x10e30c;
    fragmented_reuse_test();
LAB_0010e30c:
    pfStack_2060 = (fdb_kvs_handle *)0x10e313;
    fragmented_reuse_test();
LAB_0010e313:
    pfStack_2060 = (fdb_kvs_handle *)0x10e318;
    fragmented_reuse_test();
LAB_0010e318:
    pfStack_2060 = (fdb_kvs_handle *)0x10e31f;
    fragmented_reuse_test();
LAB_0010e31f:
    pfStack_2060 = (fdb_kvs_handle *)0x10e326;
    fragmented_reuse_test();
  }
  pfStack_2060 = (fdb_kvs_handle *)enter_reuse_via_separate_kvs_test;
  fragmented_reuse_test();
  pcStackY_2528 = (code *)0x10e34a;
  pcStack_2088 = pcVar23;
  pfStack_2080 = pfVar9;
  pfStack_2078 = pfVar10;
  pfStack_2070 = (fdb_kvs_handle *)pcVar12;
  pfStack_2068 = (fdb_kvs_handle *)pcVar13;
  pfStack_2060 = pfVar20;
  gettimeofday(&tStack_24f0,(__timezone_ptr_t)0x0);
  pcStackY_2528 = (code *)0x10e34f;
  memleak_start();
  pfStack_2500 = (fdb_doc *)0x0;
  pcStackY_2528 = (code *)0x10e368;
  fdb_get_default_kvs_config();
  pcStackY_2528 = (code *)0x10e378;
  fdb_get_default_config();
  fStack_2180.compaction_threshold = '\0';
  fStack_2180.block_reusing_threshold = 0x23;
  fStack_2180.num_keeping_headers = 10;
  pcStackY_2528 = (code *)0x10e39f;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStackY_2528 = (code *)0x10e3b6;
  fdb_open(&pfStack_2510,"./staleblktest1",&fStack_2180);
  pcStackY_2528 = (code *)0x10e3cd;
  fdb_kvs_open(pfStack_2510,&pfStack_2518,"db",&fStack_22e0);
  pcStackY_2528 = (code *)0x10e3e4;
  fdb_kvs_open(pfStack_2510,&pfStack_24f8,"db2",&fStack_22e0);
  pcVar12 = acStack_2280;
  doc = (fdb_doc **)0x6161616161616161;
  pcVar13 = acStack_24e0;
  pcVar23 = (char *)0x0;
  do {
    pcStackY_2528 = (code *)0x10e410;
    sprintf(pcVar12,"%dkey",pcVar23);
    pfVar20 = pfStack_2518;
    builtin_strncpy(acStack_24e0,"aaaaaaaaaaa",0xc);
    pcStackY_2528 = (code *)0x10e42f;
    sVar7 = strlen(pcVar12);
    pcStackY_2528 = (code *)0x10e43a;
    sVar5 = strlen(pcVar13);
    pcStackY_2528 = (code *)0x10e44e;
    fVar2 = fdb_set_kv(pfVar20,pcVar12,sVar7,pcVar13,sVar5);
    pfVar20 = pfStack_24f8;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStackY_2528 = (code *)0x10e759;
      enter_reuse_via_separate_kvs_test();
LAB_0010e759:
      pcStackY_2528 = (code *)0x10e760;
      enter_reuse_via_separate_kvs_test();
LAB_0010e760:
      pcStackY_2528 = (code *)0x10e767;
      enter_reuse_via_separate_kvs_test();
      goto LAB_0010e767;
    }
    pcStackY_2528 = (code *)0x10e463;
    sVar7 = strlen(pcVar12);
    pcStackY_2528 = (code *)0x10e46e;
    sVar5 = strlen(pcVar13);
    pcStackY_2528 = (code *)0x10e482;
    fVar2 = fdb_set_kv(pfVar20,pcVar12,sVar7,pcVar13,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e759;
    pcStackY_2528 = (code *)0x10e499;
    fVar2 = fdb_commit(pfStack_2510,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e760;
    uVar16 = (int)pcVar23 + 1;
    pcVar23 = (char *)(ulong)uVar16;
  } while (uVar16 != 10);
  pcVar13 = (char *)0x0;
  pcVar23 = acStack_2280;
  pcVar12 = acStack_24e0;
  doc = (fdb_doc **)0x0;
  do {
    pfVar20 = pfStack_2518;
    builtin_strncpy(acStack_2280,"0key",5);
    builtin_strncpy(acStack_24e0,
                    "bbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbb"
                    ,0x80);
    pcStackY_2528 = (code *)0x10e521;
    sVar7 = strlen(pcVar23);
    pcStackY_2528 = (code *)0x10e52c;
    sVar5 = strlen(pcVar12);
    pcStackY_2528 = (code *)0x10e540;
    fVar2 = fdb_set_kv(pfVar20,pcVar23,sVar7,pcVar12,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e76e;
    pcStackY_2528 = (code *)0x10e55a;
    fVar2 = fdb_get_file_info(pfStack_2510,&fStack_22c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e767;
    uVar16 = (int)doc + 1;
    doc = (fdb_doc **)(ulong)uVar16;
  } while (fStack_22c8.file_size < 0x1000000);
  pcStackY_2528 = (code *)0x10e580;
  sVar3 = sb_check_block_reusing(pfStack_2518);
  if (sVar3 == SBD_RECLAIM) {
    pcStackY_2528 = (code *)0x10e598;
    fVar2 = fdb_commit(pfStack_2510,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e786;
    pcVar12 = acStack_2280;
    pcVar13 = acStack_24e0;
    pcVar23 = (char *)0x0;
    do {
      pcStackY_2528 = (code *)0x10e5c2;
      sprintf(pcVar12,"key%d",pcVar23);
      pfVar20 = pfStack_2518;
      builtin_strncpy(acStack_24e0,
                      "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                      ,0x80);
      pcStackY_2528 = (code *)0x10e612;
      sVar7 = strlen(pcVar12);
      pcStackY_2528 = (code *)0x10e61d;
      sVar5 = strlen(pcVar13);
      pcStackY_2528 = (code *)0x10e631;
      fVar2 = fdb_set_kv(pfVar20,pcVar12,sVar7,pcVar13,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e775;
      uVar21 = (int)pcVar23 + 1;
      pcVar23 = (char *)(ulong)uVar21;
    } while (uVar16 != uVar21);
    pcStackY_2528 = (code *)0x10e652;
    fVar2 = fdb_commit(pfStack_2510,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e78d;
    pcStackY_2528 = (code *)0x10e67a;
    fdb_iterator_init(pfStack_24f8,&pfStack_2508,(void *)0x0,0,(void *)0x0,0,0);
    pcVar23 = (char *)0xa;
    doc = &pfStack_2500;
    do {
      pcStackY_2528 = (code *)0x10e691;
      fVar2 = fdb_iterator_get(pfStack_2508,doc);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e77c;
      pcStackY_2528 = (code *)0x10e6a3;
      fdb_doc_free(pfStack_2500);
      pfStack_2500 = (fdb_doc *)0x0;
      pcStackY_2528 = (code *)0x10e6b6;
      fVar2 = fdb_iterator_next(pfStack_2508);
      uVar16 = (int)pcVar23 - 1;
      pcVar23 = (char *)(ulong)uVar16;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar16 != 0) goto LAB_0010e794;
    pcStackY_2528 = (code *)0x10e6cf;
    fdb_iterator_close(pfStack_2508);
    pcStackY_2528 = (code *)0x10e6d9;
    fVar2 = fdb_kvs_close(pfStack_2518);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e799;
    pcStackY_2528 = (code *)0x10e6eb;
    fVar2 = fdb_kvs_close(pfStack_24f8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStackY_2528 = (code *)0x10e6fd;
      fVar2 = fdb_close(pfStack_2510);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStackY_2528 = (code *)0x10e70a;
        fdb_shutdown();
        pcStackY_2528 = (code *)0x10e70f;
        memleak_end();
        pcVar12 = "%s PASSED\n";
        if (enter_reuse_via_separate_kvs_test()::__test_pass != '\0') {
          pcVar12 = "%s FAILED\n";
        }
        pcStackY_2528 = (code *)0x10e740;
        fprintf(_stderr,pcVar12,"enter reuse via separate kvs test");
        return;
      }
      goto LAB_0010e7a7;
    }
  }
  else {
LAB_0010e781:
    pcStackY_2528 = (code *)0x10e786;
    enter_reuse_via_separate_kvs_test();
LAB_0010e786:
    pcStackY_2528 = (code *)0x10e78d;
    enter_reuse_via_separate_kvs_test();
LAB_0010e78d:
    pcStackY_2528 = (code *)0x10e794;
    enter_reuse_via_separate_kvs_test();
LAB_0010e794:
    pcStackY_2528 = (code *)0x10e799;
    enter_reuse_via_separate_kvs_test();
LAB_0010e799:
    pcStackY_2528 = (code *)0x10e7a0;
    enter_reuse_via_separate_kvs_test();
  }
  pcStackY_2528 = (code *)0x10e7a7;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7a7:
  pcStackY_2528 = child_function;
  enter_reuse_via_separate_kvs_test();
  ppfStackY_2550 = doc;
  sStackY_2540 = sVar7;
  pcStackY_2538 = pcVar12;
  pcStackY_2530 = pcVar13;
  pcStackY_2528 = (code *)pcVar23;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStackY_2850.block_reusing_threshold = 0x41;
  fStackY_2850.num_keeping_headers = 5;
  fdb_open(&pfStackY_2978,"./staleblktest1",&fStackY_2850);
  fdb_kvs_open(pfStackY_2978,&pfStackY_2980,"db",&fStackY_2970);
  iVar4 = 0;
  uVar18 = 0;
  do {
    sprintf(acStackY_2958,"key%d",uVar18);
    sprintf(acStackY_2758,"seqno%d",uVar18);
    pfVar20 = pfStackY_2980;
    sVar5 = strlen(acStackY_2958);
    sVar7 = strlen(acStackY_2758);
    fdb_set_kv(pfVar20,acStackY_2958,sVar5,acStackY_2758,sVar7);
    if ((int)(uVar18 / 100) * 100 + iVar4 == 0) {
      fdb_commit(pfStackY_2978,(int)(uVar18 / 500) * 500 + iVar4 == 0);
    }
    uVar18 = (ulong)((int)uVar18 + 1);
    iVar4 = iVar4 + -1;
  } while( true );
LAB_0010c36c:
  pcStack_4a8 = (code *)0x10c373;
  snapshot_before_block_reuse_test();
LAB_0010c373:
  pcStack_4a8 = (code *)0x10c37a;
  snapshot_before_block_reuse_test();
LAB_0010c37a:
  pcStack_4a8 = (code *)0x10c381;
  snapshot_before_block_reuse_test();
LAB_0010c381:
  pcStack_4a8 = (code *)0x10c388;
  snapshot_before_block_reuse_test();
  fVar2 = extraout_EAX_00;
  goto LAB_0010c388;
LAB_0010c694:
  pcStack_670 = (code *)0x10c69b;
  snapshot_after_block_reuse_test();
LAB_0010c69b:
  pcStack_670 = (code *)0x10c6a2;
  snapshot_after_block_reuse_test();
  goto LAB_0010c6a2;
LAB_0010c9d3:
  pcStack_828 = (code *)0x10c9da;
  snapshot_inmem_before_block_reuse_test();
LAB_0010c9da:
  pcStack_828 = (code *)0x10c9e1;
  snapshot_inmem_before_block_reuse_test();
LAB_0010c9e1:
  pcStack_828 = (code *)0x10c9e8;
  snapshot_inmem_before_block_reuse_test();
LAB_0010c9e8:
  pcStack_828 = (code *)0x10c9ef;
  snapshot_inmem_before_block_reuse_test();
  fVar2 = extraout_EAX_01;
  goto LAB_0010c9ef;
code_r0x0010cc6c:
  unaff_RBP = unaff_RBP + 0x400;
  if (unaff_RBP == 0xfff) goto code_r0x0010cc7c;
  goto LAB_0010cc13;
code_r0x0010cc7c:
  pcStack_b10 = (code *)0x10cc8b;
  fVar2 = fdb_get_file_info(pfStack_b00,&fStack_a90);
  aVar24 = aStack_af0;
  sVar19 = sStack_af8;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d06a;
  handle.seqtree = (btree *)&(aStack_af0.seqtree)->vsize;
  sVar6 = (size_t)((int)sStack_af8 + 8);
  if (0xffffff < fStack_a90.file_size) goto code_r0x0010ccb6;
  goto LAB_0010cc04;
LAB_0010d06a:
  pcStack_b10 = (code *)0x10d071;
  variable_value_size_test();
LAB_0010d071:
  pcStack_b10 = (code *)0x10d078;
  variable_value_size_test();
  aVar25 = handle;
LAB_0010d078:
  handle = aVar25;
  pcStack_b10 = (code *)0x10d07f;
  variable_value_size_test();
LAB_0010d07f:
  pcStack_b10 = (code *)0x10d086;
  variable_value_size_test();
  sVar19 = unaff_RBP;
  aVar24 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar23;
  goto LAB_0010d086;
code_r0x0010ccb6:
  pcStack_b10 = (code *)0x10ccbf;
  sVar3 = sb_check_block_reusing((fdb_kvs_handle *)aStack_b08.seqtree);
  if (sVar3 != SBD_RECLAIM) goto LAB_0010d08d;
  pcStack_b10 = (code *)0x10ccd4;
  fVar2 = fdb_commit(pfStack_b00,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d092;
  pcStack_b10 = (code *)0x10ccf1;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_b08.seqtree,
                            (fdb_kvs_handle **)&aStack_ad8.seqtree,0xffffffffffffffff);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d099;
  if ((fdb_kvs_handle *)aVar24.seqtree != (fdb_kvs_handle *)0x0) {
    aStack_ac8.seqtree = aVar24.seqtree;
    pcVar12 = (char *)0x0;
    aStack_ac0 = handle;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = aVar24;
      uVar16 = (int)sVar19 + 1;
      pcStack_b10 = (code *)0x10cd43;
      sprintf((char *)&fStack_a48,"%d_key",(ulong)uVar16);
      sStack_af8 = sVar19;
      aStack_af0 = aVar24;
      if ((int)uVar16 < 2) {
        uVar18 = 0;
      }
      else {
        uVar18 = sVar19 & 0xffffffff;
        pcStack_b10 = (code *)0x10cd65;
        memset(pcVar13,99,uVar18);
      }
      pcVar23 = (char *)aStack_b08;
      pcVar13[uVar18] = '\0';
      pfVar22 = &fStack_a48;
      pcStack_b10 = (code *)0x10cd81;
      sVar5 = strlen((char *)pfVar22);
      unaff_RBP = sVar5 + 1;
      pcStack_b10 = (code *)0x10cd8d;
      sVar5 = strlen(pcVar13);
      pcStack_b10 = (code *)0x10cda2;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar23,pfVar22,unaff_RBP,pcVar13,sVar5 + 1);
      handle = aStack_ac0;
      aVar25 = SUB168(auVar1 * ZEXT816(0xcccccccccccccccd),8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d078;
      if ((fdb_kvs_handle *)
          (&((fdb_kvs_config *)&(aStack_ac0.seqtree)->ksize)->create_if_missing +
          ~(((ulong)aVar24.seqtree / 5 & 0xfffffffffffffffe) * 5)) == (fdb_kvs_handle *)pcVar12) {
        pcStack_b10 = (code *)0x10cddc;
        fVar2 = fdb_commit(pfStack_b00,'\x01');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d07f;
      }
      aVar24.seqtree = (btree *)((long)&aStack_af0.seqtree[-1].aux + 7);
      pcVar12 = (char *)&((btree *)pcVar12)->vsize;
      sVar19 = (size_t)((int)sStack_af8 - 8);
    } while (aStack_ac8.seqtree != (btree *)pcVar12);
  }
  pfVar22 = &fStack_a48;
  pcStack_b10 = (code *)0x10ce11;
  fVar2 = fdb_commit(pfStack_b00,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0a0;
  aVar24.seqtree = (btree *)&fStack_a48;
  pcStack_b10 = (code *)0x10ce37;
  sprintf((char *)aVar24.seqtree,"%d_key",0x200);
  pcStack_b10 = (code *)0x10ce49;
  memset(pcVar13,0x61,0x4fffff);
  pcVar12 = (char *)aStack_b08;
  pcVar13[0x4fffff] = '\0';
  pcStack_b10 = (code *)0x10ce5c;
  sVar5 = strlen((char *)aVar24.seqtree);
  pfVar22 = (fdb_config *)(sVar5 + 1);
  pcStack_b10 = (code *)0x10ce68;
  sVar5 = strlen(pcVar13);
  pcStack_b10 = (code *)0x10ce7d;
  fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar12,aVar24.seqtree,(size_t)pfVar22,pcVar13,sVar5 + 1);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0a7;
  pcStack_b10 = (code *)0x10ce94;
  fVar2 = fdb_commit(pfStack_b00,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0ae;
  pcStack_b10 = (code *)0x10ceba;
  sprintf((char *)&fStack_a48,"%d_key",0x200);
  pcStack_b10 = (code *)0x10cecc;
  memset(pcVar13,0x61,0x1ff);
  pcVar12 = (char *)aStack_ad0;
  pcVar13[0x1ff] = '\0';
  pcStack_b10 = (code *)0x10cee0;
  sVar5 = strlen((char *)&fStack_a48);
  pcStack_b10 = (code *)0x10cef9;
  fVar2 = fdb_get_kv((fdb_kvs_handle *)pcVar12,(btree *)&fStack_a48,sVar5 + 1,&aStack_ae0.seqtree,
                     (size_t *)&pkStack_ae8);
  aVar25 = aStack_ae0;
  aVar24.seqtree = (btree *)&fStack_a48;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0b5;
  pcStack_b10 = (code *)0x10cf16;
  iVar4 = bcmp(pcVar13,aStack_ae0.seqtree,(size_t)pkStack_ae8);
  if (iVar4 != 0) goto LAB_0010d0bc;
  pcStack_b10 = (code *)0x10cf26;
  fVar2 = fdb_free_block(aVar25.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0c4;
  aVar25.seqtree = (btree *)&fStack_a48;
  pcStack_b10 = (code *)0x10cf4c;
  sprintf((char *)aVar25.seqtree,"%d_key",0x800);
  pcStack_b10 = (code *)0x10cf5e;
  memset(pcVar13,0x62,0x7ff);
  pcVar12 = (char *)aStack_ad8;
  pcVar13[0x7ff] = '\0';
  pcStack_b10 = (code *)0x10cf72;
  sVar5 = strlen((char *)aVar25.seqtree);
  pcStack_b10 = (code *)0x10cf8b;
  fVar2 = fdb_get_kv((fdb_kvs_handle *)pcVar12,aVar25.seqtree,sVar5 + 1,&aStack_ae0.seqtree,
                     (size_t *)&pkStack_ae8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0cb;
  pcStack_b10 = (code *)0x10cfa8;
  iVar4 = bcmp(pcVar13,aStack_ae0.seqtree,(size_t)pkStack_ae8);
  aVar25 = aStack_ae0;
  if (iVar4 != 0) goto LAB_0010d0d2;
  pcStack_b10 = (code *)0x10cfb8;
  fVar2 = fdb_free_block(aStack_ae0.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0da;
  pcStack_b10 = (code *)0x10cfc8;
  operator_delete__(pcVar13);
  pcStack_b10 = (code *)0x10cfd1;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_b08.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0e1;
  pcStack_b10 = (code *)0x10cfe3;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_ad0.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0e8;
  pcStack_b10 = (code *)0x10cff5;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_ad8.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0ef;
  pcStack_b10 = (code *)0x10d007;
  fVar2 = fdb_close(pfStack_b00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_b10 = (code *)0x10d014;
    fdb_shutdown();
    pcStack_b10 = (code *)0x10d019;
    memleak_end();
    pcVar12 = "%s PASSED\n";
    if (variable_value_size_test()::__test_pass != '\0') {
      pcVar12 = "%s FAILED\n";
    }
    pcStack_b10 = (code *)0x10d04a;
    fprintf(_stderr,pcVar12,"variable value size test");
    return;
  }
  goto LAB_0010d0f6;
LAB_0010d44c:
  pcStack_11e8 = (code *)0x10d453;
  rollback_with_num_keeping_headers();
LAB_0010d453:
  pcStack_11e8 = (code *)0x10d45a;
  rollback_with_num_keeping_headers();
LAB_0010d45a:
  pcStack_11e8 = (code *)0x10d461;
  rollback_with_num_keeping_headers();
  goto LAB_0010d461;
LAB_0010d9ef:
  pcStack_16d0 = (code *)0x10d9f6;
  crash_and_recover_with_num_keeping_test();
LAB_0010d9f6:
  pcStack_16d0 = (code *)0x10d9fd;
  crash_and_recover_with_num_keeping_test();
LAB_0010d9fd:
  pcStack_16d0 = (code *)0x10da04;
  crash_and_recover_with_num_keeping_test();
LAB_0010da04:
  pcStack_16d0 = (code *)0x10da0b;
  crash_and_recover_with_num_keeping_test();
LAB_0010da0b:
  pcStack_16d0 = (code *)0x10da12;
  crash_and_recover_with_num_keeping_test();
LAB_0010da12:
  pcStack_16d0 = (code *)0x10da19;
  crash_and_recover_with_num_keeping_test();
LAB_0010da19:
  pcStack_16d0 = (code *)0x10da20;
  crash_and_recover_with_num_keeping_test();
  goto LAB_0010da20;
LAB_0010de20:
  pfStack_1b78 = (fdb_kvs_handle *)0x10de27;
  reuse_on_delete_test();
LAB_0010de27:
  pfVar8 = pfVar9;
  pfStack_1b78 = (fdb_kvs_handle *)0x10de2e;
  reuse_on_delete_test();
LAB_0010de2e:
  pfStack_1b78 = (fdb_kvs_handle *)0x10de35;
  reuse_on_delete_test();
LAB_0010de35:
  pfStack_1b78 = (fdb_kvs_handle *)0x10de3c;
  reuse_on_delete_test();
  pfVar9 = pfVar8;
  goto LAB_0010de3c;
LAB_0010e2ca:
  pfStack_2060 = (fdb_kvs_handle *)0x10e2d1;
  fragmented_reuse_test();
LAB_0010e2d1:
  pfStack_2060 = (fdb_kvs_handle *)0x10e2d8;
  fragmented_reuse_test();
LAB_0010e2d8:
  pfStack_2060 = (fdb_kvs_handle *)0x10e2df;
  fragmented_reuse_test();
LAB_0010e2df:
  pfStack_2060 = (fdb_kvs_handle *)0x10e2e6;
  fragmented_reuse_test();
LAB_0010e2e6:
  pfStack_2060 = (fdb_kvs_handle *)0x10e2ed;
  fragmented_reuse_test();
LAB_0010e2ed:
  pfStack_2060 = (fdb_kvs_handle *)0x10e2f4;
  fragmented_reuse_test();
  goto LAB_0010e2f4;
LAB_0010e767:
  pcStackY_2528 = (code *)0x10e76e;
  enter_reuse_via_separate_kvs_test();
LAB_0010e76e:
  pcStackY_2528 = (code *)0x10e775;
  enter_reuse_via_separate_kvs_test();
LAB_0010e775:
  pcStackY_2528 = (code *)0x10e77c;
  enter_reuse_via_separate_kvs_test();
LAB_0010e77c:
  pcStackY_2528 = (code *)0x10e781;
  enter_reuse_via_separate_kvs_test();
  goto LAB_0010e781;
}

Assistant:

void verify_high_num_keeping_headers_param_test() {
    memleak_start();
    TEST_INIT();

    int i, r;
    int low_seq = 0;
    int nheaders=100;
    char keybuf[16];
    void *rvalue;
    size_t rvalue_len;

    fdb_file_handle* dbfile;
    fdb_kvs_handle* db;
    fdb_kvs_handle* snap_db;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_file_info file_info;

    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    // init
    fconfig.compaction_threshold = 0;
    fconfig.num_keeping_headers = nheaders;
    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open(dbfile, &db, "num_keep", &kvs_config);
    TEST_STATUS(status);

    const char *key = "key";
    const char *val = "val";

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size <= SB_MIN_BLOCK_REUSING_FILESIZE);

    // create lowest commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);
    low_seq = i;

    // create 100 headers
    for (i = 0; i < nheaders; ++i) {
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), (char *)"reu", 4);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // make sure all blocks up to kept headers are reused
    i = low_seq;
    while (--i) {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
    }

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // -101 commit fail
    status = fdb_snapshot_open(db, &snap_db, low_seq);
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    // -100 commit pass
    low_seq++;
    status = fdb_snapshot_open(db, &snap_db, low_seq);
    TEST_STATUS(status);

    status = fdb_get_kv(db, keybuf, strlen(keybuf), &rvalue, &rvalue_len);
    TEST_STATUS(status);

    // cleanup
    status = fdb_free_block(rvalue);
    TEST_STATUS(status);
    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    status = fdb_shutdown();
    TEST_STATUS(status);

    memleak_end();
    TEST_RESULT("verify high num keeping headers param test");
}